

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_util.h
# Opt level: O0

void google::protobuf::TestUtil::ExpectExtensionsClear<proto2_unittest::TestAllExtensions>
               (TestAllExtensions *message)

{
  bool bVar1;
  ConstType_conflict2 CVar2;
  char *pcVar3;
  ConstType psVar4;
  ConstType pOVar5;
  ConstType pTVar6;
  ConstType pFVar7;
  ConstType pIVar8;
  ConstType pPVar9;
  void *extraout_RDX;
  undefined1 *puVar10;
  char *in_R9;
  string local_1d40;
  AssertHelper local_1d20;
  Message local_1d18;
  bool local_1d09;
  undefined1 local_1d08 [8];
  AssertionResult gtest_ar__61;
  AssertHelper local_1cd8;
  Message local_1cd0;
  bool local_1cc1;
  undefined1 local_1cc0 [8];
  AssertionResult gtest_ar__60;
  AssertHelper local_1c90;
  Message local_1c88;
  bool local_1c79;
  undefined1 local_1c78 [8];
  AssertionResult gtest_ar__59;
  AssertHelper local_1c48;
  Message local_1c40;
  bool local_1c31;
  undefined1 local_1c30 [8];
  AssertionResult gtest_ar__58;
  Message local_1c18;
  undefined1 local_1c10 [8];
  AssertionResult gtest_ar_72;
  Message local_1bf8;
  undefined1 local_1bf0 [8];
  AssertionResult gtest_ar_71;
  Message local_1bd8;
  ConstType local_1bcc;
  undefined1 local_1bc8 [8];
  AssertionResult gtest_ar_70;
  Message local_1bb0;
  ConstType local_1ba4;
  undefined1 local_1ba0 [8];
  AssertionResult gtest_ar_69;
  Message local_1b88;
  ConstType local_1b7c;
  undefined1 local_1b78 [8];
  AssertionResult gtest_ar_68;
  Message local_1b60;
  undefined1 local_1b58 [8];
  AssertionResult gtest_ar_67;
  Message local_1b40;
  undefined1 local_1b38 [8];
  AssertionResult gtest_ar_66;
  AssertHelper local_1b08;
  Message local_1b00;
  bool local_1af1;
  undefined1 local_1af0 [8];
  AssertionResult gtest_ar__57;
  Message local_1ad8;
  ConstType_conflict5 local_1ad0;
  double local_1ac8;
  undefined1 local_1ac0 [8];
  AssertionResult gtest_ar_65;
  Message local_1aa8;
  ConstType_conflict4 local_1a9c;
  double local_1a98;
  undefined1 local_1a90 [8];
  AssertionResult gtest_ar_64;
  Message local_1a78;
  ConstType_conflict1 local_1a70;
  int local_1a64;
  undefined1 local_1a60 [8];
  AssertionResult gtest_ar_63;
  Message local_1a48;
  ConstType local_1a40;
  int local_1a3c;
  undefined1 local_1a38 [8];
  AssertionResult gtest_ar_62;
  Message local_1a20;
  ConstType_conflict local_1a18;
  int local_1a0c;
  undefined1 local_1a08 [8];
  AssertionResult gtest_ar_61;
  Message local_19f0;
  ConstType_conflict3 local_19e8 [2];
  undefined1 local_19e0 [8];
  AssertionResult gtest_ar_60;
  Message local_19c8;
  ConstType_conflict1 local_19c0;
  int local_19b4;
  undefined1 local_19b0 [8];
  AssertionResult gtest_ar_59;
  Message local_1998;
  ConstType local_1990;
  int local_198c;
  undefined1 local_1988 [8];
  AssertionResult gtest_ar_58;
  Message local_1970;
  ConstType_conflict local_1968;
  int local_195c;
  undefined1 local_1958 [8];
  AssertionResult gtest_ar_57;
  Message local_1940;
  ConstType_conflict3 local_1938 [2];
  undefined1 local_1930 [8];
  AssertionResult gtest_ar_56;
  Message local_1918;
  ConstType_conflict1 local_1910;
  int local_1904;
  undefined1 local_1900 [8];
  AssertionResult gtest_ar_55;
  Message local_18e8;
  ConstType local_18e0;
  int local_18dc;
  undefined1 local_18d8 [8];
  AssertionResult gtest_ar_54;
  AssertHelper local_18a8;
  Message local_18a0;
  bool local_1891;
  undefined1 local_1890 [8];
  AssertionResult gtest_ar__56;
  AssertHelper local_1860;
  Message local_1858;
  bool local_1849;
  undefined1 local_1848 [8];
  AssertionResult gtest_ar__55;
  AssertHelper local_1818;
  Message local_1810;
  bool local_1801;
  undefined1 local_1800 [8];
  AssertionResult gtest_ar__54;
  AssertHelper local_17d0;
  Message local_17c8;
  bool local_17b9;
  undefined1 local_17b8 [8];
  AssertionResult gtest_ar__53;
  AssertHelper local_1788;
  Message local_1780;
  bool local_1771;
  undefined1 local_1770 [8];
  AssertionResult gtest_ar__52;
  AssertHelper local_1740;
  Message local_1738;
  bool local_1729;
  undefined1 local_1728 [8];
  AssertionResult gtest_ar__51;
  AssertHelper local_16f8;
  Message local_16f0;
  bool local_16e1;
  undefined1 local_16e0 [8];
  AssertionResult gtest_ar__50;
  AssertHelper local_16b0;
  Message local_16a8;
  bool local_1699;
  undefined1 local_1698 [8];
  AssertionResult gtest_ar__49;
  AssertHelper local_1668;
  Message local_1660;
  bool local_1651;
  undefined1 local_1650 [8];
  AssertionResult gtest_ar__48;
  AssertHelper local_1620;
  Message local_1618;
  bool local_1609;
  undefined1 local_1608 [8];
  AssertionResult gtest_ar__47;
  AssertHelper local_15d8;
  Message local_15d0;
  bool local_15c1;
  undefined1 local_15c0 [8];
  AssertionResult gtest_ar__46;
  AssertHelper local_1590;
  Message local_1588;
  bool local_1579;
  undefined1 local_1578 [8];
  AssertionResult gtest_ar__45;
  AssertHelper local_1548;
  Message local_1540;
  bool local_1531;
  undefined1 local_1530 [8];
  AssertionResult gtest_ar__44;
  AssertHelper local_1500;
  Message local_14f8;
  bool local_14e9;
  undefined1 local_14e8 [8];
  AssertionResult gtest_ar__43;
  AssertHelper local_14b8;
  Message local_14b0;
  bool local_14a1;
  undefined1 local_14a0 [8];
  AssertionResult gtest_ar__42;
  AssertHelper local_1470;
  Message local_1468;
  bool local_1459;
  undefined1 local_1458 [8];
  AssertionResult gtest_ar__41;
  AssertHelper local_1428;
  Message local_1420;
  bool local_1411;
  undefined1 local_1410 [8];
  AssertionResult gtest_ar__40;
  AssertHelper local_13e0;
  Message local_13d8;
  bool local_13c9;
  undefined1 local_13c8 [8];
  AssertionResult gtest_ar__39;
  AssertHelper local_1398;
  Message local_1390;
  bool local_1381;
  undefined1 local_1380 [8];
  AssertionResult gtest_ar__38;
  AssertHelper local_1350;
  Message local_1348;
  bool local_1339;
  undefined1 local_1338 [8];
  AssertionResult gtest_ar__37;
  Message local_1320;
  int local_1318 [2];
  undefined1 local_1310 [8];
  AssertionResult gtest_ar_53;
  Message local_12f8;
  int local_12f0 [2];
  undefined1 local_12e8 [8];
  AssertionResult gtest_ar_52;
  Message local_12d0;
  int local_12c8 [2];
  undefined1 local_12c0 [8];
  AssertionResult gtest_ar_51;
  Message local_12a8;
  int local_12a0 [2];
  undefined1 local_1298 [8];
  AssertionResult gtest_ar_50;
  Message local_1280;
  int local_1278 [2];
  undefined1 local_1270 [8];
  AssertionResult gtest_ar_49;
  Message local_1258;
  int local_1250 [2];
  undefined1 local_1248 [8];
  AssertionResult gtest_ar_48;
  Message local_1230;
  int local_1228 [2];
  undefined1 local_1220 [8];
  AssertionResult gtest_ar_47;
  Message local_1208;
  int local_1200 [2];
  undefined1 local_11f8 [8];
  AssertionResult gtest_ar_46;
  Message local_11e0;
  int local_11d8 [2];
  undefined1 local_11d0 [8];
  AssertionResult gtest_ar_45;
  Message local_11b8;
  int local_11b0 [2];
  undefined1 local_11a8 [8];
  AssertionResult gtest_ar_44;
  Message local_1190;
  int local_1188 [2];
  undefined1 local_1180 [8];
  AssertionResult gtest_ar_43;
  Message local_1168;
  int local_1160 [2];
  undefined1 local_1158 [8];
  AssertionResult gtest_ar_42;
  Message local_1140;
  int local_1138 [2];
  undefined1 local_1130 [8];
  AssertionResult gtest_ar_41;
  Message local_1118;
  int local_1110 [2];
  undefined1 local_1108 [8];
  AssertionResult gtest_ar_40;
  Message local_10f0;
  int local_10e8 [2];
  undefined1 local_10e0 [8];
  AssertionResult gtest_ar_39;
  Message local_10c8;
  int local_10c0 [2];
  undefined1 local_10b8 [8];
  AssertionResult gtest_ar_38;
  Message local_10a0;
  int local_1098 [2];
  undefined1 local_1090 [8];
  AssertionResult gtest_ar_37;
  Message local_1078;
  int local_1070 [2];
  undefined1 local_1068 [8];
  AssertionResult gtest_ar_36;
  Message local_1050;
  int local_1048 [2];
  undefined1 local_1040 [8];
  AssertionResult gtest_ar_35;
  Message local_1028;
  int local_1020 [2];
  undefined1 local_1018 [8];
  AssertionResult gtest_ar_34;
  Message local_1000;
  int local_ff8 [2];
  undefined1 local_ff0 [8];
  AssertionResult gtest_ar_33;
  Message local_fd8;
  int local_fd0 [2];
  undefined1 local_fc8 [8];
  AssertionResult gtest_ar_32;
  Message local_fb0;
  int local_fa8 [2];
  undefined1 local_fa0 [8];
  AssertionResult gtest_ar_31;
  Message local_f88;
  int local_f80 [2];
  undefined1 local_f78 [8];
  AssertionResult gtest_ar_30;
  Message local_f60;
  int local_f58 [2];
  undefined1 local_f50 [8];
  AssertionResult gtest_ar_29;
  Message local_f38;
  undefined1 local_f30 [8];
  AssertionResult gtest_ar_28;
  Message local_f18;
  undefined1 local_f10 [8];
  AssertionResult gtest_ar_27;
  Message local_ef8;
  undefined1 local_ef0 [8];
  AssertionResult gtest_ar_26;
  Message local_ed8;
  ConstType local_ecc;
  undefined1 local_ec8 [8];
  AssertionResult gtest_ar_25;
  Message local_eb0;
  ConstType local_ea4;
  undefined1 local_ea0 [8];
  AssertionResult gtest_ar_24;
  Message local_e88;
  ConstType local_e7c;
  undefined1 local_e78 [8];
  AssertionResult gtest_ar_23;
  Message local_e60;
  int32_t local_e58;
  int local_e54;
  undefined1 local_e50 [8];
  AssertionResult gtest_ar_22;
  Message local_e38;
  int32_t local_e30;
  int local_e2c;
  undefined1 local_e28 [8];
  AssertionResult gtest_ar_21;
  Message local_e10;
  int32_t local_e08;
  int local_e04;
  undefined1 local_e00 [8];
  AssertionResult gtest_ar_20;
  Message local_de8;
  int32_t local_de0;
  int local_ddc;
  undefined1 local_dd8 [8];
  AssertionResult gtest_ar_19;
  Message local_dc0;
  int local_db8 [2];
  undefined1 local_db0 [8];
  AssertionResult gtest_ar_18;
  Message local_d98;
  int32_t local_d90;
  int local_d8c;
  undefined1 local_d88 [8];
  AssertionResult gtest_ar_17;
  Message local_d70;
  int32_t local_d68;
  int local_d64;
  undefined1 local_d60 [8];
  AssertionResult gtest_ar_16;
  AssertHelper local_d30;
  Message local_d28;
  bool local_d19;
  undefined1 local_d18 [8];
  AssertionResult gtest_ar__36;
  AssertHelper local_ce8;
  Message local_ce0;
  bool local_cd1;
  undefined1 local_cd0 [8];
  AssertionResult gtest_ar__35;
  AssertHelper local_ca0;
  Message local_c98;
  bool local_c89;
  undefined1 local_c88 [8];
  AssertionResult gtest_ar__34;
  AssertHelper local_c58;
  Message local_c50;
  bool local_c41;
  undefined1 local_c40 [8];
  AssertionResult gtest_ar__33;
  AssertHelper local_c10;
  Message local_c08;
  bool local_bf9;
  undefined1 local_bf8 [8];
  AssertionResult gtest_ar__32;
  AssertHelper local_bc8;
  Message local_bc0;
  bool local_bb1;
  undefined1 local_bb0 [8];
  AssertionResult gtest_ar__31;
  AssertHelper local_b80;
  Message local_b78;
  bool local_b69;
  undefined1 local_b68 [8];
  AssertionResult gtest_ar__30;
  Message local_b50;
  undefined1 local_b48 [8];
  AssertionResult gtest_ar_15;
  Message local_b30;
  undefined1 local_b28 [8];
  AssertionResult gtest_ar_14;
  AssertHelper local_af8;
  Message local_af0;
  bool local_ae1;
  undefined1 local_ae0 [8];
  AssertionResult gtest_ar__29;
  Message local_ac8;
  ConstType_conflict5 local_ac0;
  int local_ab4;
  undefined1 local_ab0 [8];
  AssertionResult gtest_ar_13;
  Message local_a98;
  ConstType_conflict4 local_a90;
  int local_a8c;
  undefined1 local_a88 [8];
  AssertionResult gtest_ar_12;
  Message local_a70;
  ConstType_conflict1 local_a68;
  int local_a5c;
  undefined1 local_a58 [8];
  AssertionResult gtest_ar_11;
  Message local_a40;
  ConstType local_a38;
  int local_a34;
  undefined1 local_a30 [8];
  AssertionResult gtest_ar_10;
  Message local_a18;
  ConstType_conflict local_a10;
  int local_a04;
  undefined1 local_a00 [8];
  AssertionResult gtest_ar_9;
  Message local_9e8;
  ConstType_conflict3 local_9e0 [2];
  undefined1 local_9d8 [8];
  AssertionResult gtest_ar_8;
  Message local_9c0;
  ConstType_conflict1 local_9b8;
  int local_9ac;
  undefined1 local_9a8 [8];
  AssertionResult gtest_ar_7;
  Message local_990;
  ConstType local_988;
  int local_984;
  undefined1 local_980 [8];
  AssertionResult gtest_ar_6;
  Message local_968;
  ConstType_conflict local_960;
  int local_954;
  undefined1 local_950 [8];
  AssertionResult gtest_ar_5;
  Message local_938;
  ConstType_conflict3 local_930 [2];
  undefined1 local_928 [8];
  AssertionResult gtest_ar_4;
  Message local_910;
  ConstType_conflict1 local_908;
  int local_8fc;
  undefined1 local_8f8 [8];
  AssertionResult gtest_ar_3;
  Message local_8e0;
  ConstType local_8d8;
  int local_8d4;
  undefined1 local_8d0 [8];
  AssertionResult gtest_ar_2;
  AssertHelper local_8a0;
  Message local_898;
  bool local_889;
  undefined1 local_888 [8];
  AssertionResult gtest_ar__28;
  AssertHelper local_858;
  Message local_850;
  bool local_841;
  undefined1 local_840 [8];
  AssertionResult gtest_ar__27;
  AssertHelper local_810;
  Message local_808;
  bool local_7f9;
  undefined1 local_7f8 [8];
  AssertionResult gtest_ar__26;
  AssertHelper local_7c8;
  Message local_7c0;
  bool local_7b1;
  undefined1 local_7b0 [8];
  AssertionResult gtest_ar__25;
  AssertHelper local_780;
  Message local_778;
  bool local_769;
  undefined1 local_768 [8];
  AssertionResult gtest_ar__24;
  AssertHelper local_738;
  Message local_730;
  bool local_721;
  undefined1 local_720 [8];
  AssertionResult gtest_ar__23;
  AssertHelper local_6f0;
  Message local_6e8;
  bool local_6d9;
  undefined1 local_6d8 [8];
  AssertionResult gtest_ar__22;
  AssertHelper local_6a8;
  Message local_6a0;
  bool local_691;
  undefined1 local_690 [8];
  AssertionResult gtest_ar__21;
  AssertHelper local_660;
  Message local_658;
  bool local_649;
  undefined1 local_648 [8];
  AssertionResult gtest_ar__20;
  AssertHelper local_618;
  Message local_610;
  bool local_601;
  undefined1 local_600 [8];
  AssertionResult gtest_ar__19;
  AssertHelper local_5d0;
  Message local_5c8;
  bool local_5b9;
  undefined1 local_5b8 [8];
  AssertionResult gtest_ar__18;
  AssertHelper local_588;
  Message local_580;
  bool local_571;
  undefined1 local_570 [8];
  AssertionResult gtest_ar__17;
  AssertHelper local_540;
  Message local_538;
  bool local_529;
  undefined1 local_528 [8];
  AssertionResult gtest_ar__16;
  AssertHelper local_4f8;
  Message local_4f0;
  bool local_4e1;
  undefined1 local_4e0 [8];
  AssertionResult gtest_ar__15;
  AssertHelper local_4b0;
  Message local_4a8;
  bool local_499;
  undefined1 local_498 [8];
  AssertionResult gtest_ar__14;
  AssertHelper local_468;
  Message local_460;
  bool local_451;
  undefined1 local_450 [8];
  AssertionResult gtest_ar__13;
  AssertHelper local_420;
  Message local_418;
  bool local_409;
  undefined1 local_408 [8];
  AssertionResult gtest_ar__12;
  AssertHelper local_3d8;
  Message local_3d0;
  bool local_3c1;
  undefined1 local_3c0 [8];
  AssertionResult gtest_ar__11;
  AssertHelper local_390;
  Message local_388;
  bool local_379;
  undefined1 local_378 [8];
  AssertionResult gtest_ar__10;
  AssertHelper local_348;
  Message local_340;
  bool local_331;
  undefined1 local_330 [8];
  AssertionResult gtest_ar__9;
  AssertHelper local_300;
  Message local_2f8;
  bool local_2e9;
  undefined1 local_2e8 [8];
  AssertionResult gtest_ar__8;
  AssertHelper local_2b8;
  Message local_2b0;
  bool local_2a1;
  undefined1 local_2a0 [8];
  AssertionResult gtest_ar__7;
  AssertHelper local_270;
  Message local_268;
  bool local_259;
  undefined1 local_258 [8];
  AssertionResult gtest_ar__6;
  AssertHelper local_228;
  Message local_220;
  bool local_211;
  undefined1 local_210 [8];
  AssertionResult gtest_ar__5;
  AssertHelper local_1e0;
  Message local_1d8;
  bool local_1c9;
  undefined1 local_1c8 [8];
  AssertionResult gtest_ar__4;
  AssertHelper local_198;
  Message local_190;
  bool local_181;
  undefined1 local_180 [8];
  AssertionResult gtest_ar__3;
  AssertHelper local_150;
  Message local_148;
  bool local_139;
  undefined1 local_138 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_108;
  Message local_100;
  bool local_f1;
  undefined1 local_f0 [8];
  AssertionResult gtest_ar__1;
  Message local_d8;
  size_t local_d0;
  int local_c4;
  undefined1 local_c0 [8];
  AssertionResult gtest_ar_1;
  Message local_a8;
  undefined1 local_a0 [8];
  AssertionResult gtest_ar;
  string local_88;
  AssertHelper local_68;
  Message local_60 [3];
  bool local_41;
  undefined1 local_40 [8];
  AssertionResult gtest_ar_;
  string serialized;
  TestAllExtensions *message_local;
  
  std::__cxx11::string::string((string *)&gtest_ar_.message_);
  local_41 = protobuf::MessageLite::SerializeToString
                       ((MessageLite *)message,(string *)&gtest_ar_.message_);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_40,&local_41,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_40);
  if (!bVar1) {
    testing::Message::Message(local_60);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_88,(internal *)local_40,(AssertionResult *)0x1d635a9,"false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_68,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0xc57,pcVar3);
    testing::internal::AssertHelper::operator=(&local_68,local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_68);
    std::__cxx11::string::~string((string *)&local_88);
    testing::Message::~Message(local_60);
  }
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._5_3_ = 0;
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_40);
  if (gtest_ar.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ == 0) {
    testing::internal::EqHelper::
    Compare<char[1],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
              ((EqHelper *)local_a0,"\"\"","serialized",(char (*) [1])(anon_var_dwarf_37cdd0 + 5),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &gtest_ar_.message_);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a0);
    if (!bVar1) {
      testing::Message::Message(&local_a8);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_a0);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xc58,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_a8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
      testing::Message::~Message(&local_a8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_a0);
    local_c4 = 0;
    local_d0 = proto2_unittest::TestAllExtensions::ByteSizeLong(message);
    testing::internal::EqHelper::Compare<int,_unsigned_long,_nullptr>
              ((EqHelper *)local_c0,"0","message.ByteSizeLong()",&local_c4,&local_d0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c0);
    if (!bVar1) {
      testing::Message::Message(&local_d8);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_c0);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar__1.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xc59,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__1.message_,&local_d8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__1.message_);
      testing::Message::~Message(&local_d8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_c0);
    bVar1 = proto2_unittest::TestAllExtensions::
            HasExtension<google::protobuf::internal::PrimitiveTypeTraits<int>,(unsigned_char)5,false,google::protobuf::internal::PrimitiveTypeTraits<int>>
                      (message,(ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::PrimitiveTypeTraits<int>,_(unsigned_char)__x05_,_false>
                                *)&proto2_unittest::optional_int32_extension);
    local_f1 = (bool)(~bVar1 & 1);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_f0,&local_f1,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f0);
    if (!bVar1) {
      testing::Message::Message(&local_100);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar__2.message_,(internal *)local_f0,
                 (AssertionResult *)"message.HasExtension(Traits::optional_int32_extension)","true",
                 "false",in_R9);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_108,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xc5c,pcVar3);
      testing::internal::AssertHelper::operator=(&local_108,&local_100);
      testing::internal::AssertHelper::~AssertHelper(&local_108);
      std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
      testing::Message::~Message(&local_100);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_f0);
    bVar1 = proto2_unittest::TestAllExtensions::
            HasExtension<google::protobuf::internal::PrimitiveTypeTraits<long>,(unsigned_char)3,false,google::protobuf::internal::PrimitiveTypeTraits<long>>
                      (message,(ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::PrimitiveTypeTraits<long>,_(unsigned_char)__x03_,_false>
                                *)proto2_unittest::optional_int64_extension);
    local_139 = (bool)(~bVar1 & 1);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_138,&local_139,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_138);
    if (!bVar1) {
      testing::Message::Message(&local_148);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar__3.message_,(internal *)local_138,
                 (AssertionResult *)"message.HasExtension(Traits::optional_int64_extension)","true",
                 "false",in_R9);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_150,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xc5d,pcVar3);
      testing::internal::AssertHelper::operator=(&local_150,&local_148);
      testing::internal::AssertHelper::~AssertHelper(&local_150);
      std::__cxx11::string::~string((string *)&gtest_ar__3.message_);
      testing::Message::~Message(&local_148);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_138);
    bVar1 = proto2_unittest::TestAllExtensions::
            HasExtension<google::protobuf::internal::PrimitiveTypeTraits<unsigned_int>,(unsigned_char)13,false,google::protobuf::internal::PrimitiveTypeTraits<unsigned_int>>
                      (message,(ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::PrimitiveTypeTraits<unsigned_int>,_(unsigned_char)__r_,_false>
                                *)&proto2_unittest::optional_uint32_extension);
    local_181 = (bool)(~bVar1 & 1);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_180,&local_181,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_180);
    if (!bVar1) {
      testing::Message::Message(&local_190);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar__4.message_,(internal *)local_180,
                 (AssertionResult *)"message.HasExtension(Traits::optional_uint32_extension)","true"
                 ,"false",in_R9);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_198,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xc5e,pcVar3);
      testing::internal::AssertHelper::operator=(&local_198,&local_190);
      testing::internal::AssertHelper::~AssertHelper(&local_198);
      std::__cxx11::string::~string((string *)&gtest_ar__4.message_);
      testing::Message::~Message(&local_190);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_180);
    bVar1 = proto2_unittest::TestAllExtensions::
            HasExtension<google::protobuf::internal::PrimitiveTypeTraits<unsigned_long>,(unsigned_char)4,false,google::protobuf::internal::PrimitiveTypeTraits<unsigned_long>>
                      (message,(ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::PrimitiveTypeTraits<unsigned_long>,_(unsigned_char)__x04_,_false>
                                *)proto2_unittest::optional_uint64_extension);
    local_1c9 = (bool)(~bVar1 & 1);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_1c8,&local_1c9,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1c8);
    if (!bVar1) {
      testing::Message::Message(&local_1d8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar__5.message_,(internal *)local_1c8,
                 (AssertionResult *)"message.HasExtension(Traits::optional_uint64_extension)","true"
                 ,"false",in_R9);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_1e0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xc5f,pcVar3);
      testing::internal::AssertHelper::operator=(&local_1e0,&local_1d8);
      testing::internal::AssertHelper::~AssertHelper(&local_1e0);
      std::__cxx11::string::~string((string *)&gtest_ar__5.message_);
      testing::Message::~Message(&local_1d8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_1c8);
    bVar1 = proto2_unittest::TestAllExtensions::
            HasExtension<google::protobuf::internal::PrimitiveTypeTraits<int>,(unsigned_char)17,false,google::protobuf::internal::PrimitiveTypeTraits<int>>
                      (message,(ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::PrimitiveTypeTraits<int>,_(unsigned_char)__x11_,_false>
                                *)&proto2_unittest::optional_sint32_extension);
    local_211 = (bool)(~bVar1 & 1);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_210,&local_211,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_210);
    if (!bVar1) {
      testing::Message::Message(&local_220);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar__6.message_,(internal *)local_210,
                 (AssertionResult *)"message.HasExtension(Traits::optional_sint32_extension)","true"
                 ,"false",in_R9);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_228,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xc60,pcVar3);
      testing::internal::AssertHelper::operator=(&local_228,&local_220);
      testing::internal::AssertHelper::~AssertHelper(&local_228);
      std::__cxx11::string::~string((string *)&gtest_ar__6.message_);
      testing::Message::~Message(&local_220);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_210);
    bVar1 = proto2_unittest::TestAllExtensions::
            HasExtension<google::protobuf::internal::PrimitiveTypeTraits<long>,(unsigned_char)18,false,google::protobuf::internal::PrimitiveTypeTraits<long>>
                      (message,(ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::PrimitiveTypeTraits<long>,_(unsigned_char)__x12_,_false>
                                *)proto2_unittest::optional_sint64_extension);
    local_259 = (bool)(~bVar1 & 1);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_258,&local_259,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_258);
    if (!bVar1) {
      testing::Message::Message(&local_268);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar__7.message_,(internal *)local_258,
                 (AssertionResult *)"message.HasExtension(Traits::optional_sint64_extension)","true"
                 ,"false",in_R9);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_270,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xc61,pcVar3);
      testing::internal::AssertHelper::operator=(&local_270,&local_268);
      testing::internal::AssertHelper::~AssertHelper(&local_270);
      std::__cxx11::string::~string((string *)&gtest_ar__7.message_);
      testing::Message::~Message(&local_268);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_258);
    bVar1 = proto2_unittest::TestAllExtensions::
            HasExtension<google::protobuf::internal::PrimitiveTypeTraits<unsigned_int>,(unsigned_char)7,false,google::protobuf::internal::PrimitiveTypeTraits<unsigned_int>>
                      (message,(ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::PrimitiveTypeTraits<unsigned_int>,_(unsigned_char)__a_,_false>
                                *)&proto2_unittest::optional_fixed32_extension);
    local_2a1 = (bool)(~bVar1 & 1);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_2a0,&local_2a1,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2a0);
    if (!bVar1) {
      testing::Message::Message(&local_2b0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar__8.message_,(internal *)local_2a0,
                 (AssertionResult *)"message.HasExtension(Traits::optional_fixed32_extension)",
                 "true","false",in_R9);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_2b8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xc62,pcVar3);
      testing::internal::AssertHelper::operator=(&local_2b8,&local_2b0);
      testing::internal::AssertHelper::~AssertHelper(&local_2b8);
      std::__cxx11::string::~string((string *)&gtest_ar__8.message_);
      testing::Message::~Message(&local_2b0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_2a0);
    bVar1 = proto2_unittest::TestAllExtensions::
            HasExtension<google::protobuf::internal::PrimitiveTypeTraits<unsigned_long>,(unsigned_char)6,false,google::protobuf::internal::PrimitiveTypeTraits<unsigned_long>>
                      (message,(ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::PrimitiveTypeTraits<unsigned_long>,_(unsigned_char)__x06_,_false>
                                *)proto2_unittest::optional_fixed64_extension);
    local_2e9 = (bool)(~bVar1 & 1);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_2e8,&local_2e9,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2e8);
    if (!bVar1) {
      testing::Message::Message(&local_2f8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar__9.message_,(internal *)local_2e8,
                 (AssertionResult *)"message.HasExtension(Traits::optional_fixed64_extension)",
                 "true","false",in_R9);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_300,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xc63,pcVar3);
      testing::internal::AssertHelper::operator=(&local_300,&local_2f8);
      testing::internal::AssertHelper::~AssertHelper(&local_300);
      std::__cxx11::string::~string((string *)&gtest_ar__9.message_);
      testing::Message::~Message(&local_2f8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_2e8);
    bVar1 = proto2_unittest::TestAllExtensions::
            HasExtension<google::protobuf::internal::PrimitiveTypeTraits<int>,(unsigned_char)15,false,google::protobuf::internal::PrimitiveTypeTraits<int>>
                      (message,(ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::PrimitiveTypeTraits<int>,_(unsigned_char)__x0f_,_false>
                                *)&proto2_unittest::optional_sfixed32_extension);
    local_331 = (bool)(~bVar1 & 1);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_330,&local_331,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_330);
    if (!bVar1) {
      testing::Message::Message(&local_340);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar__10.message_,(internal *)local_330,
                 (AssertionResult *)"message.HasExtension(Traits::optional_sfixed32_extension)",
                 "true","false",in_R9);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_348,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xc64,pcVar3);
      testing::internal::AssertHelper::operator=(&local_348,&local_340);
      testing::internal::AssertHelper::~AssertHelper(&local_348);
      std::__cxx11::string::~string((string *)&gtest_ar__10.message_);
      testing::Message::~Message(&local_340);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_330);
    bVar1 = proto2_unittest::TestAllExtensions::
            HasExtension<google::protobuf::internal::PrimitiveTypeTraits<long>,(unsigned_char)16,false,google::protobuf::internal::PrimitiveTypeTraits<long>>
                      (message,(ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::PrimitiveTypeTraits<long>,_(unsigned_char)__x10_,_false>
                                *)proto2_unittest::optional_sfixed64_extension);
    local_379 = (bool)(~bVar1 & 1);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_378,&local_379,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_378);
    if (!bVar1) {
      testing::Message::Message(&local_388);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar__11.message_,(internal *)local_378,
                 (AssertionResult *)"message.HasExtension(Traits::optional_sfixed64_extension)",
                 "true","false",in_R9);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_390,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xc65,pcVar3);
      testing::internal::AssertHelper::operator=(&local_390,&local_388);
      testing::internal::AssertHelper::~AssertHelper(&local_390);
      std::__cxx11::string::~string((string *)&gtest_ar__11.message_);
      testing::Message::~Message(&local_388);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_378);
    bVar1 = proto2_unittest::TestAllExtensions::
            HasExtension<google::protobuf::internal::PrimitiveTypeTraits<float>,(unsigned_char)2,false,google::protobuf::internal::PrimitiveTypeTraits<float>>
                      (message,(ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::PrimitiveTypeTraits<float>,_(unsigned_char)__x02_,_false>
                                *)&proto2_unittest::optional_float_extension);
    local_3c1 = (bool)(~bVar1 & 1);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_3c0,&local_3c1,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3c0);
    if (!bVar1) {
      testing::Message::Message(&local_3d0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar__12.message_,(internal *)local_3c0,
                 (AssertionResult *)"message.HasExtension(Traits::optional_float_extension)","true",
                 "false",in_R9);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_3d8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xc66,pcVar3);
      testing::internal::AssertHelper::operator=(&local_3d8,&local_3d0);
      testing::internal::AssertHelper::~AssertHelper(&local_3d8);
      std::__cxx11::string::~string((string *)&gtest_ar__12.message_);
      testing::Message::~Message(&local_3d0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_3c0);
    bVar1 = proto2_unittest::TestAllExtensions::
            HasExtension<google::protobuf::internal::PrimitiveTypeTraits<double>,(unsigned_char)1,false,google::protobuf::internal::PrimitiveTypeTraits<double>>
                      (message,(ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::PrimitiveTypeTraits<double>,_(unsigned_char)__x01_,_false>
                                *)proto2_unittest::optional_double_extension);
    local_409 = (bool)(~bVar1 & 1);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_408,&local_409,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_408);
    if (!bVar1) {
      testing::Message::Message(&local_418);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar__13.message_,(internal *)local_408,
                 (AssertionResult *)"message.HasExtension(Traits::optional_double_extension)","true"
                 ,"false",in_R9);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_420,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xc67,pcVar3);
      testing::internal::AssertHelper::operator=(&local_420,&local_418);
      testing::internal::AssertHelper::~AssertHelper(&local_420);
      std::__cxx11::string::~string((string *)&gtest_ar__13.message_);
      testing::Message::~Message(&local_418);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_408);
    bVar1 = proto2_unittest::TestAllExtensions::
            HasExtension<google::protobuf::internal::PrimitiveTypeTraits<bool>,(unsigned_char)8,false,google::protobuf::internal::PrimitiveTypeTraits<bool>>
                      (message,(ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::PrimitiveTypeTraits<bool>,_(unsigned_char)__b_,_false>
                                *)&proto2_unittest::optional_bool_extension);
    local_451 = (bool)(~bVar1 & 1);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_450,&local_451,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_450);
    if (!bVar1) {
      testing::Message::Message(&local_460);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar__14.message_,(internal *)local_450,
                 (AssertionResult *)"message.HasExtension(Traits::optional_bool_extension)","true",
                 "false",in_R9);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_468,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xc68,pcVar3);
      testing::internal::AssertHelper::operator=(&local_468,&local_460);
      testing::internal::AssertHelper::~AssertHelper(&local_468);
      std::__cxx11::string::~string((string *)&gtest_ar__14.message_);
      testing::Message::~Message(&local_460);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_450);
    bVar1 = proto2_unittest::TestAllExtensions::
            HasExtension<google::protobuf::internal::StringTypeTraits,(unsigned_char)12,false,google::protobuf::internal::StringTypeTraits>
                      (message,(ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::StringTypeTraits,_(unsigned_char)__f_,_false>
                                *)proto2_unittest::optional_string_extension);
    local_499 = (bool)(~bVar1 & 1);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_498,&local_499,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_498);
    if (!bVar1) {
      testing::Message::Message(&local_4a8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar__15.message_,(internal *)local_498,
                 (AssertionResult *)"message.HasExtension(Traits::optional_string_extension)","true"
                 ,"false",in_R9);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_4b0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xc69,pcVar3);
      testing::internal::AssertHelper::operator=(&local_4b0,&local_4a8);
      testing::internal::AssertHelper::~AssertHelper(&local_4b0);
      std::__cxx11::string::~string((string *)&gtest_ar__15.message_);
      testing::Message::~Message(&local_4a8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_498);
    bVar1 = proto2_unittest::TestAllExtensions::
            HasExtension<google::protobuf::internal::StringTypeTraits,(unsigned_char)12,false,google::protobuf::internal::StringTypeTraits>
                      (message,(ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::StringTypeTraits,_(unsigned_char)__f_,_false>
                                *)proto2_unittest::optional_bytes_extension);
    local_4e1 = (bool)(~bVar1 & 1);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_4e0,&local_4e1,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4e0);
    if (!bVar1) {
      testing::Message::Message(&local_4f0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar__16.message_,(internal *)local_4e0,
                 (AssertionResult *)"message.HasExtension(Traits::optional_bytes_extension)","true",
                 "false",in_R9);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_4f8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xc6a,pcVar3);
      testing::internal::AssertHelper::operator=(&local_4f8,&local_4f0);
      testing::internal::AssertHelper::~AssertHelper(&local_4f8);
      std::__cxx11::string::~string((string *)&gtest_ar__16.message_);
      testing::Message::~Message(&local_4f0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_4e0);
    bVar1 = proto2_unittest::TestAllExtensions::
            HasExtension<google::protobuf::internal::MessageTypeTraits<proto2_unittest::OptionalGroup_extension>,(unsigned_char)10,false,google::protobuf::internal::MessageTypeTraits<proto2_unittest::OptionalGroup_extension>>
                      (message,(ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::MessageTypeTraits<proto2_unittest::OptionalGroup_extension>,_(unsigned_char)__n_,_false>
                                *)proto2_unittest::optionalgroup_extension);
    local_529 = (bool)(~bVar1 & 1);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_528,&local_529,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_528);
    if (!bVar1) {
      testing::Message::Message(&local_538);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar__17.message_,(internal *)local_528,
                 (AssertionResult *)"message.HasExtension(Traits::optionalgroup_extension)","true",
                 "false",in_R9);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_540,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xc6c,pcVar3);
      testing::internal::AssertHelper::operator=(&local_540,&local_538);
      testing::internal::AssertHelper::~AssertHelper(&local_540);
      std::__cxx11::string::~string((string *)&gtest_ar__17.message_);
      testing::Message::~Message(&local_538);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_528);
    bVar1 = proto2_unittest::TestAllExtensions::
            HasExtension<google::protobuf::internal::MessageTypeTraits<proto2_unittest::TestAllTypes_NestedMessage>,(unsigned_char)11,false,google::protobuf::internal::MessageTypeTraits<proto2_unittest::TestAllTypes_NestedMessage>>
                      (message,(ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::MessageTypeTraits<proto2_unittest::TestAllTypes_NestedMessage>,_(unsigned_char)__v_,_false>
                                *)proto2_unittest::optional_nested_message_extension);
    local_571 = (bool)(~bVar1 & 1);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_570,&local_571,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_570);
    if (!bVar1) {
      testing::Message::Message(&local_580);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar__18.message_,(internal *)local_570,
                 (AssertionResult *)
                 "message.HasExtension(Traits::optional_nested_message_extension)","true","false",
                 in_R9);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_588,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xc6d,pcVar3);
      testing::internal::AssertHelper::operator=(&local_588,&local_580);
      testing::internal::AssertHelper::~AssertHelper(&local_588);
      std::__cxx11::string::~string((string *)&gtest_ar__18.message_);
      testing::Message::~Message(&local_580);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_570);
    bVar1 = proto2_unittest::TestAllExtensions::
            HasExtension<google::protobuf::internal::MessageTypeTraits<proto2_unittest::ForeignMessage>,(unsigned_char)11,false,google::protobuf::internal::MessageTypeTraits<proto2_unittest::ForeignMessage>>
                      (message,(ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::MessageTypeTraits<proto2_unittest::ForeignMessage>,_(unsigned_char)__v_,_false>
                                *)proto2_unittest::optional_foreign_message_extension);
    local_5b9 = (bool)(~bVar1 & 1);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_5b8,&local_5b9,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5b8);
    if (!bVar1) {
      testing::Message::Message(&local_5c8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar__19.message_,(internal *)local_5b8,
                 (AssertionResult *)
                 "message.HasExtension(Traits::optional_foreign_message_extension)","true","false",
                 in_R9);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_5d0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xc6f,pcVar3);
      testing::internal::AssertHelper::operator=(&local_5d0,&local_5c8);
      testing::internal::AssertHelper::~AssertHelper(&local_5d0);
      std::__cxx11::string::~string((string *)&gtest_ar__19.message_);
      testing::Message::~Message(&local_5c8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_5b8);
    bVar1 = proto2_unittest::TestAllExtensions::
            HasExtension<google::protobuf::internal::MessageTypeTraits<proto2_unittest_import::ImportMessage>,(unsigned_char)11,false,google::protobuf::internal::MessageTypeTraits<proto2_unittest_import::ImportMessage>>
                      (message,(ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::MessageTypeTraits<proto2_unittest_import::ImportMessage>,_(unsigned_char)__v_,_false>
                                *)proto2_unittest::optional_import_message_extension);
    local_601 = (bool)(~bVar1 & 1);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_600,&local_601,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_600);
    if (!bVar1) {
      testing::Message::Message(&local_610);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar__20.message_,(internal *)local_600,
                 (AssertionResult *)
                 "message.HasExtension(Traits::optional_import_message_extension)","true","false",
                 in_R9);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_618,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xc70,pcVar3);
      testing::internal::AssertHelper::operator=(&local_618,&local_610);
      testing::internal::AssertHelper::~AssertHelper(&local_618);
      std::__cxx11::string::~string((string *)&gtest_ar__20.message_);
      testing::Message::~Message(&local_610);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_600);
    bVar1 = proto2_unittest::TestAllExtensions::
            HasExtension<google::protobuf::internal::MessageTypeTraits<proto2_unittest_import::PublicImportMessage>,(unsigned_char)11,false,google::protobuf::internal::MessageTypeTraits<proto2_unittest_import::PublicImportMessage>>
                      (message,(ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::MessageTypeTraits<proto2_unittest_import::PublicImportMessage>,_(unsigned_char)__v_,_false>
                                *)proto2_unittest::optional_public_import_message_extension);
    local_649 = (bool)(~bVar1 & 1);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_648,&local_649,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_648);
    if (!bVar1) {
      testing::Message::Message(&local_658);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar__21.message_,(internal *)local_648,
                 (AssertionResult *)
                 "message.HasExtension(Traits::optional_public_import_message_extension)","true",
                 "false",in_R9);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_660,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xc72,pcVar3);
      testing::internal::AssertHelper::operator=(&local_660,&local_658);
      testing::internal::AssertHelper::~AssertHelper(&local_660);
      std::__cxx11::string::~string((string *)&gtest_ar__21.message_);
      testing::Message::~Message(&local_658);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_648);
    bVar1 = proto2_unittest::TestAllExtensions::
            HasExtension<google::protobuf::internal::MessageTypeTraits<proto2_unittest::TestAllTypes_NestedMessage>,(unsigned_char)11,false,google::protobuf::internal::MessageTypeTraits<proto2_unittest::TestAllTypes_NestedMessage>>
                      (message,(ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::MessageTypeTraits<proto2_unittest::TestAllTypes_NestedMessage>,_(unsigned_char)__v_,_false>
                                *)proto2_unittest::optional_lazy_message_extension);
    local_691 = (bool)(~bVar1 & 1);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_690,&local_691,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_690);
    if (!bVar1) {
      testing::Message::Message(&local_6a0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar__22.message_,(internal *)local_690,
                 (AssertionResult *)"message.HasExtension(Traits::optional_lazy_message_extension)",
                 "true","false",in_R9);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_6a8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xc73,pcVar3);
      testing::internal::AssertHelper::operator=(&local_6a8,&local_6a0);
      testing::internal::AssertHelper::~AssertHelper(&local_6a8);
      std::__cxx11::string::~string((string *)&gtest_ar__22.message_);
      testing::Message::~Message(&local_6a0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_690);
    bVar1 = proto2_unittest::TestAllExtensions::
            HasExtension<google::protobuf::internal::MessageTypeTraits<proto2_unittest::TestAllTypes_NestedMessage>,(unsigned_char)11,false,google::protobuf::internal::MessageTypeTraits<proto2_unittest::TestAllTypes_NestedMessage>>
                      (message,(ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::MessageTypeTraits<proto2_unittest::TestAllTypes_NestedMessage>,_(unsigned_char)__v_,_false>
                                *)proto2_unittest::optional_unverified_lazy_message_extension);
    local_6d9 = (bool)(~bVar1 & 1);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_6d8,&local_6d9,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6d8);
    if (!bVar1) {
      testing::Message::Message(&local_6e8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar__23.message_,(internal *)local_6d8,
                 (AssertionResult *)
                 "message.HasExtension(Traits::optional_unverified_lazy_message_extension)","true",
                 "false",in_R9);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_6f0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xc75,pcVar3);
      testing::internal::AssertHelper::operator=(&local_6f0,&local_6e8);
      testing::internal::AssertHelper::~AssertHelper(&local_6f0);
      std::__cxx11::string::~string((string *)&gtest_ar__23.message_);
      testing::Message::~Message(&local_6e8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_6d8);
    bVar1 = proto2_unittest::TestAllExtensions::
            HasExtension<google::protobuf::internal::EnumTypeTraits<proto2_unittest::TestAllTypes_NestedEnum>,(unsigned_char)14,false,google::protobuf::internal::EnumTypeTraits<proto2_unittest::TestAllTypes_NestedEnum>>
                      (message,(ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::EnumTypeTraits<proto2_unittest::TestAllTypes_NestedEnum>,_(unsigned_char)__x0e_,_false>
                                *)&proto2_unittest::optional_nested_enum_extension);
    local_721 = (bool)(~bVar1 & 1);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_720,&local_721,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_720);
    if (!bVar1) {
      testing::Message::Message(&local_730);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar__24.message_,(internal *)local_720,
                 (AssertionResult *)"message.HasExtension(Traits::optional_nested_enum_extension)",
                 "true","false",in_R9);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_738,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xc77,pcVar3);
      testing::internal::AssertHelper::operator=(&local_738,&local_730);
      testing::internal::AssertHelper::~AssertHelper(&local_738);
      std::__cxx11::string::~string((string *)&gtest_ar__24.message_);
      testing::Message::~Message(&local_730);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_720);
    bVar1 = proto2_unittest::TestAllExtensions::
            HasExtension<google::protobuf::internal::EnumTypeTraits<proto2_unittest::ForeignEnum>,(unsigned_char)14,false,google::protobuf::internal::EnumTypeTraits<proto2_unittest::ForeignEnum>>
                      (message,(ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::EnumTypeTraits<proto2_unittest::ForeignEnum>,_(unsigned_char)__x0e_,_false>
                                *)&proto2_unittest::optional_foreign_enum_extension);
    local_769 = (bool)(~bVar1 & 1);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_768,&local_769,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_768);
    if (!bVar1) {
      testing::Message::Message(&local_778);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar__25.message_,(internal *)local_768,
                 (AssertionResult *)"message.HasExtension(Traits::optional_foreign_enum_extension)",
                 "true","false",in_R9);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_780,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xc78,pcVar3);
      testing::internal::AssertHelper::operator=(&local_780,&local_778);
      testing::internal::AssertHelper::~AssertHelper(&local_780);
      std::__cxx11::string::~string((string *)&gtest_ar__25.message_);
      testing::Message::~Message(&local_778);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_768);
    bVar1 = proto2_unittest::TestAllExtensions::
            HasExtension<google::protobuf::internal::EnumTypeTraits<proto2_unittest_import::ImportEnum>,(unsigned_char)14,false,google::protobuf::internal::EnumTypeTraits<proto2_unittest_import::ImportEnum>>
                      (message,(ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::EnumTypeTraits<proto2_unittest_import::ImportEnum>,_(unsigned_char)__x0e_,_false>
                                *)&proto2_unittest::optional_import_enum_extension);
    local_7b1 = (bool)(~bVar1 & 1);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_7b0,&local_7b1,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_7b0);
    if (!bVar1) {
      testing::Message::Message(&local_7c0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar__26.message_,(internal *)local_7b0,
                 (AssertionResult *)"message.HasExtension(Traits::optional_import_enum_extension)",
                 "true","false",in_R9);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_7c8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xc79,pcVar3);
      testing::internal::AssertHelper::operator=(&local_7c8,&local_7c0);
      testing::internal::AssertHelper::~AssertHelper(&local_7c8);
      std::__cxx11::string::~string((string *)&gtest_ar__26.message_);
      testing::Message::~Message(&local_7c0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_7b0);
    bVar1 = proto2_unittest::TestAllExtensions::
            HasExtension<google::protobuf::internal::StringTypeTraits,(unsigned_char)12,false,google::protobuf::internal::StringTypeTraits>
                      (message,(ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::StringTypeTraits,_(unsigned_char)__f_,_false>
                                *)proto2_unittest::optional_string_piece_extension);
    local_7f9 = (bool)(~bVar1 & 1);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_7f8,&local_7f9,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_7f8);
    if (!bVar1) {
      testing::Message::Message(&local_808);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar__27.message_,(internal *)local_7f8,
                 (AssertionResult *)"message.HasExtension(Traits::optional_string_piece_extension)",
                 "true","false",in_R9);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_810,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xc7b,pcVar3);
      testing::internal::AssertHelper::operator=(&local_810,&local_808);
      testing::internal::AssertHelper::~AssertHelper(&local_810);
      std::__cxx11::string::~string((string *)&gtest_ar__27.message_);
      testing::Message::~Message(&local_808);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_7f8);
    bVar1 = proto2_unittest::TestAllExtensions::
            HasExtension<google::protobuf::internal::StringTypeTraits,(unsigned_char)12,false,google::protobuf::internal::StringTypeTraits>
                      (message,(ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::StringTypeTraits,_(unsigned_char)__f_,_false>
                                *)proto2_unittest::optional_cord_extension);
    local_841 = (bool)(~bVar1 & 1);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_840,&local_841,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_840);
    if (!bVar1) {
      testing::Message::Message(&local_850);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar__28.message_,(internal *)local_840,
                 (AssertionResult *)"message.HasExtension(Traits::optional_cord_extension)","true",
                 "false",in_R9);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_858,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xc7c,pcVar3);
      testing::internal::AssertHelper::operator=(&local_858,&local_850);
      testing::internal::AssertHelper::~AssertHelper(&local_858);
      std::__cxx11::string::~string((string *)&gtest_ar__28.message_);
      testing::Message::~Message(&local_850);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_840);
    bVar1 = proto2_unittest::TestAllExtensions::
            HasExtension<google::protobuf::internal::StringTypeTraits,(unsigned_char)12,false,google::protobuf::internal::StringTypeTraits>
                      (message,(ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::StringTypeTraits,_(unsigned_char)__f_,_false>
                                *)proto2_unittest::optional_bytes_cord_extension);
    local_889 = (bool)(~bVar1 & 1);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_888,&local_889,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_888);
    if (!bVar1) {
      testing::Message::Message(&local_898);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar_2.message_,(internal *)local_888,
                 (AssertionResult *)"message.HasExtension(Traits::optional_bytes_cord_extension)",
                 "true","false",in_R9);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_8a0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xc7d,pcVar3);
      testing::internal::AssertHelper::operator=(&local_8a0,&local_898);
      testing::internal::AssertHelper::~AssertHelper(&local_8a0);
      std::__cxx11::string::~string((string *)&gtest_ar_2.message_);
      testing::Message::~Message(&local_898);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_888);
    local_8d4 = 0;
    local_8d8 = proto2_unittest::TestAllExtensions::
                GetExtension<google::protobuf::internal::PrimitiveTypeTraits<int>,_(unsigned_char)__x05_,_false,_0>
                          (message,(ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::PrimitiveTypeTraits<int>,_(unsigned_char)__x05_,_false>
                                    *)&proto2_unittest::optional_int32_extension);
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              ((EqHelper *)local_8d0,"0","message.GetExtension(Traits::optional_int32_extension)",
               &local_8d4,&local_8d8);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_8d0);
    if (!bVar1) {
      testing::Message::Message(&local_8e0);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_8d0);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xc80,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_8e0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
      testing::Message::~Message(&local_8e0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_8d0);
    local_8fc = 0;
    local_908 = proto2_unittest::TestAllExtensions::
                GetExtension<google::protobuf::internal::PrimitiveTypeTraits<long>,_(unsigned_char)__x03_,_false,_0>
                          (message,(ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::PrimitiveTypeTraits<long>,_(unsigned_char)__x03_,_false>
                                    *)proto2_unittest::optional_int64_extension);
    testing::internal::EqHelper::Compare<int,_long,_nullptr>
              ((EqHelper *)local_8f8,"0","message.GetExtension(Traits::optional_int64_extension)",
               &local_8fc,&local_908);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_8f8);
    if (!bVar1) {
      testing::Message::Message(&local_910);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_8f8);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xc81,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_910);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
      testing::Message::~Message(&local_910);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_8f8);
    local_930[1] = 0;
    local_930[0] = proto2_unittest::TestAllExtensions::
                   GetExtension<google::protobuf::internal::PrimitiveTypeTraits<unsigned_int>,_(unsigned_char)__r_,_false,_0>
                             (message,(ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::PrimitiveTypeTraits<unsigned_int>,_(unsigned_char)__r_,_false>
                                       *)&proto2_unittest::optional_uint32_extension);
    testing::internal::EqHelper::Compare<int,_unsigned_int,_nullptr>
              ((EqHelper *)local_928,"0","message.GetExtension(Traits::optional_uint32_extension)",
               (int *)(local_930 + 1),local_930);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_928);
    if (!bVar1) {
      testing::Message::Message(&local_938);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_928);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xc82,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_938);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
      testing::Message::~Message(&local_938);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_928);
    local_954 = 0;
    local_960 = proto2_unittest::TestAllExtensions::
                GetExtension<google::protobuf::internal::PrimitiveTypeTraits<unsigned_long>,_(unsigned_char)__x04_,_false,_0>
                          (message,(ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::PrimitiveTypeTraits<unsigned_long>,_(unsigned_char)__x04_,_false>
                                    *)proto2_unittest::optional_uint64_extension);
    testing::internal::EqHelper::Compare<int,_unsigned_long,_nullptr>
              ((EqHelper *)local_950,"0","message.GetExtension(Traits::optional_uint64_extension)",
               &local_954,&local_960);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_950);
    if (!bVar1) {
      testing::Message::Message(&local_968);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_950);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xc83,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_968);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
      testing::Message::~Message(&local_968);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_950);
    local_984 = 0;
    local_988 = proto2_unittest::TestAllExtensions::
                GetExtension<google::protobuf::internal::PrimitiveTypeTraits<int>,_(unsigned_char)__x11_,_false,_0>
                          (message,(ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::PrimitiveTypeTraits<int>,_(unsigned_char)__x11_,_false>
                                    *)&proto2_unittest::optional_sint32_extension);
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              ((EqHelper *)local_980,"0","message.GetExtension(Traits::optional_sint32_extension)",
               &local_984,&local_988);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_980);
    if (!bVar1) {
      testing::Message::Message(&local_990);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_980);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xc84,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_990);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
      testing::Message::~Message(&local_990);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_980);
    local_9ac = 0;
    local_9b8 = proto2_unittest::TestAllExtensions::
                GetExtension<google::protobuf::internal::PrimitiveTypeTraits<long>,_(unsigned_char)__x12_,_false,_0>
                          (message,(ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::PrimitiveTypeTraits<long>,_(unsigned_char)__x12_,_false>
                                    *)proto2_unittest::optional_sint64_extension);
    testing::internal::EqHelper::Compare<int,_long,_nullptr>
              ((EqHelper *)local_9a8,"0","message.GetExtension(Traits::optional_sint64_extension)",
               &local_9ac,&local_9b8);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_9a8);
    if (!bVar1) {
      testing::Message::Message(&local_9c0);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_9a8);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xc85,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8.message_,&local_9c0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
      testing::Message::~Message(&local_9c0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_9a8);
    local_9e0[1] = 0;
    local_9e0[0] = proto2_unittest::TestAllExtensions::
                   GetExtension<google::protobuf::internal::PrimitiveTypeTraits<unsigned_int>,_(unsigned_char)__a_,_false,_0>
                             (message,(ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::PrimitiveTypeTraits<unsigned_int>,_(unsigned_char)__a_,_false>
                                       *)&proto2_unittest::optional_fixed32_extension);
    testing::internal::EqHelper::Compare<int,_unsigned_int,_nullptr>
              ((EqHelper *)local_9d8,"0","message.GetExtension(Traits::optional_fixed32_extension)",
               (int *)(local_9e0 + 1),local_9e0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_9d8);
    if (!bVar1) {
      testing::Message::Message(&local_9e8);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_9d8);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_9.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xc86,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_9.message_,&local_9e8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9.message_);
      testing::Message::~Message(&local_9e8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_9d8);
    local_a04 = 0;
    local_a10 = proto2_unittest::TestAllExtensions::
                GetExtension<google::protobuf::internal::PrimitiveTypeTraits<unsigned_long>,_(unsigned_char)__x06_,_false,_0>
                          (message,(ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::PrimitiveTypeTraits<unsigned_long>,_(unsigned_char)__x06_,_false>
                                    *)proto2_unittest::optional_fixed64_extension);
    testing::internal::EqHelper::Compare<int,_unsigned_long,_nullptr>
              ((EqHelper *)local_a00,"0","message.GetExtension(Traits::optional_fixed64_extension)",
               &local_a04,&local_a10);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a00);
    if (!bVar1) {
      testing::Message::Message(&local_a18);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_a00);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_10.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xc87,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_10.message_,&local_a18);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_10.message_);
      testing::Message::~Message(&local_a18);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_a00);
    local_a34 = 0;
    local_a38 = proto2_unittest::TestAllExtensions::
                GetExtension<google::protobuf::internal::PrimitiveTypeTraits<int>,_(unsigned_char)__x0f_,_false,_0>
                          (message,(ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::PrimitiveTypeTraits<int>,_(unsigned_char)__x0f_,_false>
                                    *)&proto2_unittest::optional_sfixed32_extension);
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              ((EqHelper *)local_a30,"0","message.GetExtension(Traits::optional_sfixed32_extension)"
               ,&local_a34,&local_a38);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a30);
    if (!bVar1) {
      testing::Message::Message(&local_a40);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_a30);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_11.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xc88,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_11.message_,&local_a40);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_11.message_);
      testing::Message::~Message(&local_a40);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_a30);
    local_a5c = 0;
    local_a68 = proto2_unittest::TestAllExtensions::
                GetExtension<google::protobuf::internal::PrimitiveTypeTraits<long>,_(unsigned_char)__x10_,_false,_0>
                          (message,(ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::PrimitiveTypeTraits<long>,_(unsigned_char)__x10_,_false>
                                    *)proto2_unittest::optional_sfixed64_extension);
    testing::internal::EqHelper::Compare<int,_long,_nullptr>
              ((EqHelper *)local_a58,"0","message.GetExtension(Traits::optional_sfixed64_extension)"
               ,&local_a5c,&local_a68);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a58);
    if (!bVar1) {
      testing::Message::Message(&local_a70);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_a58);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_12.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xc89,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_12.message_,&local_a70);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_12.message_);
      testing::Message::~Message(&local_a70);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_a58);
    local_a8c = 0;
    local_a90 = proto2_unittest::TestAllExtensions::
                GetExtension<google::protobuf::internal::PrimitiveTypeTraits<float>,_(unsigned_char)__x02_,_false,_0>
                          (message,(ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::PrimitiveTypeTraits<float>,_(unsigned_char)__x02_,_false>
                                    *)&proto2_unittest::optional_float_extension);
    testing::internal::EqHelper::Compare<int,_float,_nullptr>
              ((EqHelper *)local_a88,"0","message.GetExtension(Traits::optional_float_extension)",
               &local_a8c,&local_a90);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a88);
    if (!bVar1) {
      testing::Message::Message(&local_a98);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_a88);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_13.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xc8a,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_13.message_,&local_a98);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_13.message_);
      testing::Message::~Message(&local_a98);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_a88);
    local_ab4 = 0;
    local_ac0 = proto2_unittest::TestAllExtensions::
                GetExtension<google::protobuf::internal::PrimitiveTypeTraits<double>,_(unsigned_char)__x01_,_false,_0>
                          (message,(ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::PrimitiveTypeTraits<double>,_(unsigned_char)__x01_,_false>
                                    *)proto2_unittest::optional_double_extension);
    testing::internal::EqHelper::Compare<int,_double,_nullptr>
              ((EqHelper *)local_ab0,"0","message.GetExtension(Traits::optional_double_extension)",
               &local_ab4,&local_ac0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_ab0);
    if (!bVar1) {
      testing::Message::Message(&local_ac8);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_ab0);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar__29.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xc8b,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__29.message_,&local_ac8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__29.message_);
      testing::Message::~Message(&local_ac8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_ab0);
    CVar2 = proto2_unittest::TestAllExtensions::
            GetExtension<google::protobuf::internal::PrimitiveTypeTraits<bool>,_(unsigned_char)__b_,_false,_0>
                      (message,(ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::PrimitiveTypeTraits<bool>,_(unsigned_char)__b_,_false>
                                *)&proto2_unittest::optional_bool_extension);
    local_ae1 = (bool)(~CVar2 & 1);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_ae0,&local_ae1,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_ae0);
    if (!bVar1) {
      testing::Message::Message(&local_af0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar_14.message_,(internal *)local_ae0,
                 (AssertionResult *)"message.GetExtension(Traits::optional_bool_extension)","true",
                 "false",in_R9);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_af8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xc8c,pcVar3);
      testing::internal::AssertHelper::operator=(&local_af8,&local_af0);
      testing::internal::AssertHelper::~AssertHelper(&local_af8);
      std::__cxx11::string::~string((string *)&gtest_ar_14.message_);
      testing::Message::~Message(&local_af0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_ae0);
    psVar4 = proto2_unittest::TestAllExtensions::
             GetExtension<google::protobuf::internal::StringTypeTraits,_(unsigned_char)__f_,_false,_0>
                       (message,(ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::StringTypeTraits,_(unsigned_char)__f_,_false>
                                 *)proto2_unittest::optional_string_extension);
    testing::internal::EqHelper::
    Compare<char[1],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
              ((EqHelper *)local_b28,"\"\"",
               "message.GetExtension(Traits::optional_string_extension)",
               (char (*) [1])(anon_var_dwarf_37cdd0 + 5),psVar4);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b28);
    if (!bVar1) {
      testing::Message::Message(&local_b30);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_b28);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_15.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xc8d,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_15.message_,&local_b30);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_15.message_);
      testing::Message::~Message(&local_b30);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_b28);
    psVar4 = proto2_unittest::TestAllExtensions::
             GetExtension<google::protobuf::internal::StringTypeTraits,_(unsigned_char)__f_,_false,_0>
                       (message,(ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::StringTypeTraits,_(unsigned_char)__f_,_false>
                                 *)proto2_unittest::optional_bytes_extension);
    testing::internal::EqHelper::
    Compare<char[1],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
              ((EqHelper *)local_b48,"\"\"","message.GetExtension(Traits::optional_bytes_extension)"
               ,(char (*) [1])(anon_var_dwarf_37cdd0 + 5),psVar4);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b48);
    if (!bVar1) {
      testing::Message::Message(&local_b50);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_b48);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar__30.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xc8e,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__30.message_,&local_b50);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__30.message_);
      testing::Message::~Message(&local_b50);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_b48);
    pOVar5 = proto2_unittest::TestAllExtensions::
             GetExtension<google::protobuf::internal::MessageTypeTraits<proto2_unittest::OptionalGroup_extension>,_(unsigned_char)__n_,_false,_0>
                       (message,(ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::MessageTypeTraits<proto2_unittest::OptionalGroup_extension>,_(unsigned_char)__n_,_false>
                                 *)proto2_unittest::optionalgroup_extension);
    bVar1 = proto2_unittest::OptionalGroup_extension::has_a(pOVar5);
    local_b69 = (bool)(~bVar1 & 1);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_b68,&local_b69,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b68);
    if (!bVar1) {
      testing::Message::Message(&local_b78);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar__31.message_,(internal *)local_b68,
                 (AssertionResult *)"message.GetExtension(Traits::optionalgroup_extension).has_a()",
                 "true","false",in_R9);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_b80,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xc91,pcVar3);
      testing::internal::AssertHelper::operator=(&local_b80,&local_b78);
      testing::internal::AssertHelper::~AssertHelper(&local_b80);
      std::__cxx11::string::~string((string *)&gtest_ar__31.message_);
      testing::Message::~Message(&local_b78);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_b68);
    pTVar6 = proto2_unittest::TestAllExtensions::
             GetExtension<google::protobuf::internal::MessageTypeTraits<proto2_unittest::TestAllTypes_NestedMessage>,_(unsigned_char)__v_,_false,_0>
                       (message,(ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::MessageTypeTraits<proto2_unittest::TestAllTypes_NestedMessage>,_(unsigned_char)__v_,_false>
                                 *)proto2_unittest::optional_nested_message_extension);
    bVar1 = proto2_unittest::TestAllTypes_NestedMessage::has_bb(pTVar6);
    local_bb1 = (bool)(~bVar1 & 1);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_bb0,&local_bb1,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_bb0);
    if (!bVar1) {
      testing::Message::Message(&local_bc0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar__32.message_,(internal *)local_bb0,
                 (AssertionResult *)
                 "message.GetExtension(Traits::optional_nested_message_extension).has_bb()","true",
                 "false",in_R9);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_bc8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xc93,pcVar3);
      testing::internal::AssertHelper::operator=(&local_bc8,&local_bc0);
      testing::internal::AssertHelper::~AssertHelper(&local_bc8);
      std::__cxx11::string::~string((string *)&gtest_ar__32.message_);
      testing::Message::~Message(&local_bc0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_bb0);
    pFVar7 = proto2_unittest::TestAllExtensions::
             GetExtension<google::protobuf::internal::MessageTypeTraits<proto2_unittest::ForeignMessage>,_(unsigned_char)__v_,_false,_0>
                       (message,(ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::MessageTypeTraits<proto2_unittest::ForeignMessage>,_(unsigned_char)__v_,_false>
                                 *)proto2_unittest::optional_foreign_message_extension);
    bVar1 = proto2_unittest::ForeignMessage::has_c(pFVar7);
    local_bf9 = (bool)(~bVar1 & 1);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_bf8,&local_bf9,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_bf8);
    if (!bVar1) {
      testing::Message::Message(&local_c08);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar__33.message_,(internal *)local_bf8,
                 (AssertionResult *)
                 "message.GetExtension(Traits::optional_foreign_message_extension).has_c()","true",
                 "false",in_R9);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_c10,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xc95,pcVar3);
      testing::internal::AssertHelper::operator=(&local_c10,&local_c08);
      testing::internal::AssertHelper::~AssertHelper(&local_c10);
      std::__cxx11::string::~string((string *)&gtest_ar__33.message_);
      testing::Message::~Message(&local_c08);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_bf8);
    pIVar8 = proto2_unittest::TestAllExtensions::
             GetExtension<google::protobuf::internal::MessageTypeTraits<proto2_unittest_import::ImportMessage>,_(unsigned_char)__v_,_false,_0>
                       (message,(ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::MessageTypeTraits<proto2_unittest_import::ImportMessage>,_(unsigned_char)__v_,_false>
                                 *)proto2_unittest::optional_import_message_extension);
    bVar1 = proto2_unittest_import::ImportMessage::has_d(pIVar8);
    local_c41 = (bool)(~bVar1 & 1);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_c40,&local_c41,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c40);
    if (!bVar1) {
      testing::Message::Message(&local_c50);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar__34.message_,(internal *)local_c40,
                 (AssertionResult *)
                 "message.GetExtension(Traits::optional_import_message_extension).has_d()","true",
                 "false",in_R9);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_c58,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xc97,pcVar3);
      testing::internal::AssertHelper::operator=(&local_c58,&local_c50);
      testing::internal::AssertHelper::~AssertHelper(&local_c58);
      std::__cxx11::string::~string((string *)&gtest_ar__34.message_);
      testing::Message::~Message(&local_c50);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_c40);
    pPVar9 = proto2_unittest::TestAllExtensions::
             GetExtension<google::protobuf::internal::MessageTypeTraits<proto2_unittest_import::PublicImportMessage>,_(unsigned_char)__v_,_false,_0>
                       (message,(ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::MessageTypeTraits<proto2_unittest_import::PublicImportMessage>,_(unsigned_char)__v_,_false>
                                 *)proto2_unittest::optional_public_import_message_extension);
    bVar1 = proto2_unittest_import::PublicImportMessage::has_e(pPVar9);
    local_c89 = (bool)(~bVar1 & 1);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_c88,&local_c89,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c88);
    if (!bVar1) {
      testing::Message::Message(&local_c98);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar__35.message_,(internal *)local_c88,
                 (AssertionResult *)
                 "message.GetExtension(Traits::optional_public_import_message_extension) .has_e()",
                 "true","false",in_R9);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_ca0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xc9a,pcVar3);
      testing::internal::AssertHelper::operator=(&local_ca0,&local_c98);
      testing::internal::AssertHelper::~AssertHelper(&local_ca0);
      std::__cxx11::string::~string((string *)&gtest_ar__35.message_);
      testing::Message::~Message(&local_c98);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_c88);
    pTVar6 = proto2_unittest::TestAllExtensions::
             GetExtension<google::protobuf::internal::MessageTypeTraits<proto2_unittest::TestAllTypes_NestedMessage>,_(unsigned_char)__v_,_false,_0>
                       (message,(ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::MessageTypeTraits<proto2_unittest::TestAllTypes_NestedMessage>,_(unsigned_char)__v_,_false>
                                 *)proto2_unittest::optional_lazy_message_extension);
    bVar1 = proto2_unittest::TestAllTypes_NestedMessage::has_bb(pTVar6);
    local_cd1 = (bool)(~bVar1 & 1);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_cd0,&local_cd1,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_cd0);
    if (!bVar1) {
      testing::Message::Message(&local_ce0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar__36.message_,(internal *)local_cd0,
                 (AssertionResult *)
                 "message.GetExtension(Traits::optional_lazy_message_extension).has_bb()","true",
                 "false",in_R9);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_ce8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xc9c,pcVar3);
      testing::internal::AssertHelper::operator=(&local_ce8,&local_ce0);
      testing::internal::AssertHelper::~AssertHelper(&local_ce8);
      std::__cxx11::string::~string((string *)&gtest_ar__36.message_);
      testing::Message::~Message(&local_ce0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_cd0);
    pTVar6 = proto2_unittest::TestAllExtensions::
             GetExtension<google::protobuf::internal::MessageTypeTraits<proto2_unittest::TestAllTypes_NestedMessage>,_(unsigned_char)__v_,_false,_0>
                       (message,(ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::MessageTypeTraits<proto2_unittest::TestAllTypes_NestedMessage>,_(unsigned_char)__v_,_false>
                                 *)proto2_unittest::optional_unverified_lazy_message_extension);
    bVar1 = proto2_unittest::TestAllTypes_NestedMessage::has_bb(pTVar6);
    local_d19 = (bool)(~bVar1 & 1);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_d18,&local_d19,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d18);
    if (!bVar1) {
      testing::Message::Message(&local_d28);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar_16.message_,(internal *)local_d18,
                 (AssertionResult *)
                 "message.GetExtension(Traits::optional_unverified_lazy_message_extension) .has_bb()"
                 ,"true","false",in_R9);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_d30,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xc9f,pcVar3);
      testing::internal::AssertHelper::operator=(&local_d30,&local_d28);
      testing::internal::AssertHelper::~AssertHelper(&local_d30);
      std::__cxx11::string::~string((string *)&gtest_ar_16.message_);
      testing::Message::~Message(&local_d28);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_d18);
    local_d64 = 0;
    pOVar5 = proto2_unittest::TestAllExtensions::
             GetExtension<google::protobuf::internal::MessageTypeTraits<proto2_unittest::OptionalGroup_extension>,_(unsigned_char)__n_,_false,_0>
                       (message,(ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::MessageTypeTraits<proto2_unittest::OptionalGroup_extension>,_(unsigned_char)__n_,_false>
                                 *)proto2_unittest::optionalgroup_extension);
    local_d68 = proto2_unittest::OptionalGroup_extension::a(pOVar5);
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              ((EqHelper *)local_d60,"0","message.GetExtension(Traits::optionalgroup_extension).a()"
               ,&local_d64,&local_d68);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d60);
    if (!bVar1) {
      testing::Message::Message(&local_d70);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_d60);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_17.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xca1,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_17.message_,&local_d70);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_17.message_);
      testing::Message::~Message(&local_d70);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_d60);
    local_d8c = 0;
    pTVar6 = proto2_unittest::TestAllExtensions::
             GetExtension<google::protobuf::internal::MessageTypeTraits<proto2_unittest::TestAllTypes_NestedMessage>,_(unsigned_char)__v_,_false,_0>
                       (message,(ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::MessageTypeTraits<proto2_unittest::TestAllTypes_NestedMessage>,_(unsigned_char)__v_,_false>
                                 *)proto2_unittest::optional_nested_message_extension);
    local_d90 = proto2_unittest::TestAllTypes_NestedMessage::bb(pTVar6);
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              ((EqHelper *)local_d88,"0",
               "message.GetExtension(Traits::optional_nested_message_extension).bb()",&local_d8c,
               &local_d90);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d88);
    if (!bVar1) {
      testing::Message::Message(&local_d98);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_d88);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_18.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xca3,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_18.message_,&local_d98);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_18.message_);
      testing::Message::~Message(&local_d98);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_d88);
    local_db8[1] = 0;
    puVar10 = proto2_unittest::optional_foreign_message_extension;
    pFVar7 = proto2_unittest::TestAllExtensions::
             GetExtension<google::protobuf::internal::MessageTypeTraits<proto2_unittest::ForeignMessage>,_(unsigned_char)__v_,_false,_0>
                       (message,(ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::MessageTypeTraits<proto2_unittest::ForeignMessage>,_(unsigned_char)__v_,_false>
                                 *)proto2_unittest::optional_foreign_message_extension);
    local_db8[0] = proto2_unittest::ForeignMessage::c(pFVar7,puVar10,extraout_RDX);
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              ((EqHelper *)local_db0,"0",
               "message.GetExtension(Traits::optional_foreign_message_extension).c()",local_db8 + 1,
               local_db8);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_db0);
    if (!bVar1) {
      testing::Message::Message(&local_dc0);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_db0);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_19.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xca5,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_19.message_,&local_dc0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_19.message_);
      testing::Message::~Message(&local_dc0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_db0);
    local_ddc = 0;
    pIVar8 = proto2_unittest::TestAllExtensions::
             GetExtension<google::protobuf::internal::MessageTypeTraits<proto2_unittest_import::ImportMessage>,_(unsigned_char)__v_,_false,_0>
                       (message,(ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::MessageTypeTraits<proto2_unittest_import::ImportMessage>,_(unsigned_char)__v_,_false>
                                 *)proto2_unittest::optional_import_message_extension);
    local_de0 = proto2_unittest_import::ImportMessage::d(pIVar8);
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              ((EqHelper *)local_dd8,"0",
               "message.GetExtension(Traits::optional_import_message_extension).d()",&local_ddc,
               &local_de0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_dd8);
    if (!bVar1) {
      testing::Message::Message(&local_de8);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_dd8);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_20.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xca7,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_20.message_,&local_de8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_20.message_);
      testing::Message::~Message(&local_de8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_dd8);
    local_e04 = 0;
    pPVar9 = proto2_unittest::TestAllExtensions::
             GetExtension<google::protobuf::internal::MessageTypeTraits<proto2_unittest_import::PublicImportMessage>,_(unsigned_char)__v_,_false,_0>
                       (message,(ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::MessageTypeTraits<proto2_unittest_import::PublicImportMessage>,_(unsigned_char)__v_,_false>
                                 *)proto2_unittest::optional_public_import_message_extension);
    local_e08 = proto2_unittest_import::PublicImportMessage::e(pPVar9);
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              ((EqHelper *)local_e00,"0",
               "message.GetExtension(Traits::optional_public_import_message_extension) .e()",
               &local_e04,&local_e08);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e00);
    if (!bVar1) {
      testing::Message::Message(&local_e10);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_e00);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_21.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xcaa,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_21.message_,&local_e10);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_21.message_);
      testing::Message::~Message(&local_e10);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_e00);
    local_e2c = 0;
    pTVar6 = proto2_unittest::TestAllExtensions::
             GetExtension<google::protobuf::internal::MessageTypeTraits<proto2_unittest::TestAllTypes_NestedMessage>,_(unsigned_char)__v_,_false,_0>
                       (message,(ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::MessageTypeTraits<proto2_unittest::TestAllTypes_NestedMessage>,_(unsigned_char)__v_,_false>
                                 *)proto2_unittest::optional_lazy_message_extension);
    local_e30 = proto2_unittest::TestAllTypes_NestedMessage::bb(pTVar6);
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              ((EqHelper *)local_e28,"0",
               "message.GetExtension(Traits::optional_lazy_message_extension).bb()",&local_e2c,
               &local_e30);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e28);
    if (!bVar1) {
      testing::Message::Message(&local_e38);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_e28);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_22.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xcac,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_22.message_,&local_e38);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_22.message_);
      testing::Message::~Message(&local_e38);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_e28);
    local_e54 = 0;
    pTVar6 = proto2_unittest::TestAllExtensions::
             GetExtension<google::protobuf::internal::MessageTypeTraits<proto2_unittest::TestAllTypes_NestedMessage>,_(unsigned_char)__v_,_false,_0>
                       (message,(ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::MessageTypeTraits<proto2_unittest::TestAllTypes_NestedMessage>,_(unsigned_char)__v_,_false>
                                 *)proto2_unittest::optional_unverified_lazy_message_extension);
    local_e58 = proto2_unittest::TestAllTypes_NestedMessage::bb(pTVar6);
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              ((EqHelper *)local_e50,"0",
               "message.GetExtension(Traits::optional_unverified_lazy_message_extension) .bb()",
               &local_e54,&local_e58);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e50);
    if (!bVar1) {
      testing::Message::Message(&local_e60);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_e50);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_23.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xcb0,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_23.message_,&local_e60);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_23.message_);
      testing::Message::~Message(&local_e60);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_e50);
    local_e7c = proto2_unittest::TestAllExtensions::
                GetExtension<google::protobuf::internal::EnumTypeTraits<proto2_unittest::TestAllTypes_NestedEnum>,_(unsigned_char)__x0e_,_false,_0>
                          (message,(ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::EnumTypeTraits<proto2_unittest::TestAllTypes_NestedEnum>,_(unsigned_char)__x0e_,_false>
                                    *)&proto2_unittest::optional_nested_enum_extension);
    testing::internal::EqHelper::
    Compare<proto2_unittest::TestAllTypes_NestedEnum,_proto2_unittest::TestAllTypes_NestedEnum,_nullptr>
              ((EqHelper *)local_e78,"Traits::TestAllTypes::FOO",
               "message.GetExtension(Traits::optional_nested_enum_extension)",
               &proto2_unittest::TestAllTypes::FOO,&local_e7c);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e78);
    if (!bVar1) {
      testing::Message::Message(&local_e88);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_e78);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_24.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xcb4,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_24.message_,&local_e88);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_24.message_);
      testing::Message::~Message(&local_e88);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_e78);
    local_ea4 = proto2_unittest::TestAllExtensions::
                GetExtension<google::protobuf::internal::EnumTypeTraits<proto2_unittest::ForeignEnum>,_(unsigned_char)__x0e_,_false,_0>
                          (message,(ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::EnumTypeTraits<proto2_unittest::ForeignEnum>,_(unsigned_char)__x0e_,_false>
                                    *)&proto2_unittest::optional_foreign_enum_extension);
    testing::internal::EqHelper::
    Compare<proto2_unittest::ForeignEnum,_proto2_unittest::ForeignEnum,_nullptr>
              ((EqHelper *)local_ea0,"Traits::FOREIGN_FOO",
               "message.GetExtension(Traits::optional_foreign_enum_extension)",
               &TestUtilTraits<proto2_unittest::TestAllExtensions>::FOREIGN_FOO,&local_ea4);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_ea0);
    if (!bVar1) {
      testing::Message::Message(&local_eb0);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_ea0);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_25.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xcb6,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_25.message_,&local_eb0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_25.message_);
      testing::Message::~Message(&local_eb0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_ea0);
    local_ecc = proto2_unittest::TestAllExtensions::
                GetExtension<google::protobuf::internal::EnumTypeTraits<proto2_unittest_import::ImportEnum>,_(unsigned_char)__x0e_,_false,_0>
                          (message,(ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::EnumTypeTraits<proto2_unittest_import::ImportEnum>,_(unsigned_char)__x0e_,_false>
                                    *)&proto2_unittest::optional_import_enum_extension);
    testing::internal::EqHelper::
    Compare<proto2_unittest_import::ImportEnum,_proto2_unittest_import::ImportEnum,_nullptr>
              ((EqHelper *)local_ec8,"Traits::IMPORT_FOO",
               "message.GetExtension(Traits::optional_import_enum_extension)",
               &TestUtilTraits<proto2_unittest::TestAllExtensions>::IMPORT_FOO,&local_ecc);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_ec8);
    if (!bVar1) {
      testing::Message::Message(&local_ed8);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_ec8);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_26.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xcb8,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_26.message_,&local_ed8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_26.message_);
      testing::Message::~Message(&local_ed8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_ec8);
    psVar4 = proto2_unittest::TestAllExtensions::
             GetExtension<google::protobuf::internal::StringTypeTraits,_(unsigned_char)__f_,_false,_0>
                       (message,(ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::StringTypeTraits,_(unsigned_char)__f_,_false>
                                 *)proto2_unittest::optional_string_piece_extension);
    testing::internal::EqHelper::
    Compare<char[1],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
              ((EqHelper *)local_ef0,"\"\"",
               "message.GetExtension(Traits::optional_string_piece_extension)",
               (char (*) [1])(anon_var_dwarf_37cdd0 + 5),psVar4);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_ef0);
    if (!bVar1) {
      testing::Message::Message(&local_ef8);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_ef0);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_27.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xcba,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_27.message_,&local_ef8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_27.message_);
      testing::Message::~Message(&local_ef8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_ef0);
    psVar4 = proto2_unittest::TestAllExtensions::
             GetExtension<google::protobuf::internal::StringTypeTraits,_(unsigned_char)__f_,_false,_0>
                       (message,(ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::StringTypeTraits,_(unsigned_char)__f_,_false>
                                 *)proto2_unittest::optional_cord_extension);
    testing::internal::EqHelper::
    Compare<char[1],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
              ((EqHelper *)local_f10,"\"\"","message.GetExtension(Traits::optional_cord_extension)",
               (char (*) [1])(anon_var_dwarf_37cdd0 + 5),psVar4);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f10);
    if (!bVar1) {
      testing::Message::Message(&local_f18);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_f10);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_28.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xcbb,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_28.message_,&local_f18);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_28.message_);
      testing::Message::~Message(&local_f18);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_f10);
    psVar4 = proto2_unittest::TestAllExtensions::
             GetExtension<google::protobuf::internal::StringTypeTraits,_(unsigned_char)__f_,_false,_0>
                       (message,(ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::StringTypeTraits,_(unsigned_char)__f_,_false>
                                 *)proto2_unittest::optional_bytes_cord_extension);
    testing::internal::EqHelper::
    Compare<char[1],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
              ((EqHelper *)local_f30,"\"\"",
               "message.GetExtension(Traits::optional_bytes_cord_extension)",
               (char (*) [1])(anon_var_dwarf_37cdd0 + 5),psVar4);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f30);
    if (!bVar1) {
      testing::Message::Message(&local_f38);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_f30);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_29.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xcbc,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_29.message_,&local_f38);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_29.message_);
      testing::Message::~Message(&local_f38);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_f30);
    local_f58[1] = 0;
    local_f58[0] = proto2_unittest::TestAllExtensions::
                   ExtensionSize<google::protobuf::internal::RepeatedPrimitiveTypeTraits<int>,(unsigned_char)5,false,google::protobuf::internal::RepeatedPrimitiveTypeTraits<int>>
                             (message,(ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::RepeatedPrimitiveTypeTraits<int>,_(unsigned_char)__x05_,_false>
                                       *)&proto2_unittest::repeated_int32_extension);
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              ((EqHelper *)local_f50,"0","message.ExtensionSize(Traits::repeated_int32_extension)",
               local_f58 + 1,local_f58);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f50);
    if (!bVar1) {
      testing::Message::Message(&local_f60);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_f50);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_30.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xcbf,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_30.message_,&local_f60);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_30.message_);
      testing::Message::~Message(&local_f60);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_f50);
    local_f80[1] = 0;
    local_f80[0] = proto2_unittest::TestAllExtensions::
                   ExtensionSize<google::protobuf::internal::RepeatedPrimitiveTypeTraits<long>,(unsigned_char)3,false,google::protobuf::internal::RepeatedPrimitiveTypeTraits<long>>
                             (message,(ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::RepeatedPrimitiveTypeTraits<long>,_(unsigned_char)__x03_,_false>
                                       *)proto2_unittest::repeated_int64_extension);
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              ((EqHelper *)local_f78,"0","message.ExtensionSize(Traits::repeated_int64_extension)",
               local_f80 + 1,local_f80);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f78);
    if (!bVar1) {
      testing::Message::Message(&local_f88);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_f78);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_31.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xcc0,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_31.message_,&local_f88);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_31.message_);
      testing::Message::~Message(&local_f88);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_f78);
    local_fa8[1] = 0;
    local_fa8[0] = proto2_unittest::TestAllExtensions::
                   ExtensionSize<google::protobuf::internal::RepeatedPrimitiveTypeTraits<unsigned_int>,(unsigned_char)13,false,google::protobuf::internal::RepeatedPrimitiveTypeTraits<unsigned_int>>
                             (message,(ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::RepeatedPrimitiveTypeTraits<unsigned_int>,_(unsigned_char)__r_,_false>
                                       *)&proto2_unittest::repeated_uint32_extension);
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              ((EqHelper *)local_fa0,"0","message.ExtensionSize(Traits::repeated_uint32_extension)",
               local_fa8 + 1,local_fa8);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_fa0);
    if (!bVar1) {
      testing::Message::Message(&local_fb0);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_fa0);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_32.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xcc1,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_32.message_,&local_fb0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_32.message_);
      testing::Message::~Message(&local_fb0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_fa0);
    local_fd0[1] = 0;
    local_fd0[0] = proto2_unittest::TestAllExtensions::
                   ExtensionSize<google::protobuf::internal::RepeatedPrimitiveTypeTraits<unsigned_long>,(unsigned_char)4,false,google::protobuf::internal::RepeatedPrimitiveTypeTraits<unsigned_long>>
                             (message,(ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::RepeatedPrimitiveTypeTraits<unsigned_long>,_(unsigned_char)__x04_,_false>
                                       *)proto2_unittest::repeated_uint64_extension);
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              ((EqHelper *)local_fc8,"0","message.ExtensionSize(Traits::repeated_uint64_extension)",
               local_fd0 + 1,local_fd0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_fc8);
    if (!bVar1) {
      testing::Message::Message(&local_fd8);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_fc8);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_33.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xcc2,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_33.message_,&local_fd8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_33.message_);
      testing::Message::~Message(&local_fd8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_fc8);
    local_ff8[1] = 0;
    local_ff8[0] = proto2_unittest::TestAllExtensions::
                   ExtensionSize<google::protobuf::internal::RepeatedPrimitiveTypeTraits<int>,(unsigned_char)17,false,google::protobuf::internal::RepeatedPrimitiveTypeTraits<int>>
                             (message,(ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::RepeatedPrimitiveTypeTraits<int>,_(unsigned_char)__x11_,_false>
                                       *)&proto2_unittest::repeated_sint32_extension);
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              ((EqHelper *)local_ff0,"0","message.ExtensionSize(Traits::repeated_sint32_extension)",
               local_ff8 + 1,local_ff8);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_ff0);
    if (!bVar1) {
      testing::Message::Message(&local_1000);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_ff0);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_34.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xcc3,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_34.message_,&local_1000);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_34.message_);
      testing::Message::~Message(&local_1000);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_ff0);
    local_1020[1] = 0;
    local_1020[0] =
         proto2_unittest::TestAllExtensions::
         ExtensionSize<google::protobuf::internal::RepeatedPrimitiveTypeTraits<long>,(unsigned_char)18,false,google::protobuf::internal::RepeatedPrimitiveTypeTraits<long>>
                   (message,(ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::RepeatedPrimitiveTypeTraits<long>,_(unsigned_char)__x12_,_false>
                             *)proto2_unittest::repeated_sint64_extension);
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              ((EqHelper *)local_1018,"0","message.ExtensionSize(Traits::repeated_sint64_extension)"
               ,local_1020 + 1,local_1020);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1018);
    if (!bVar1) {
      testing::Message::Message(&local_1028);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1018);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_35.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xcc4,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_35.message_,&local_1028);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_35.message_);
      testing::Message::~Message(&local_1028);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_1018);
    local_1048[1] = 0;
    local_1048[0] =
         proto2_unittest::TestAllExtensions::
         ExtensionSize<google::protobuf::internal::RepeatedPrimitiveTypeTraits<unsigned_int>,(unsigned_char)7,false,google::protobuf::internal::RepeatedPrimitiveTypeTraits<unsigned_int>>
                   (message,(ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::RepeatedPrimitiveTypeTraits<unsigned_int>,_(unsigned_char)__a_,_false>
                             *)&proto2_unittest::repeated_fixed32_extension);
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              ((EqHelper *)local_1040,"0",
               "message.ExtensionSize(Traits::repeated_fixed32_extension)",local_1048 + 1,local_1048
              );
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1040);
    if (!bVar1) {
      testing::Message::Message(&local_1050);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1040);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_36.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xcc5,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_36.message_,&local_1050);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_36.message_);
      testing::Message::~Message(&local_1050);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_1040);
    local_1070[1] = 0;
    local_1070[0] =
         proto2_unittest::TestAllExtensions::
         ExtensionSize<google::protobuf::internal::RepeatedPrimitiveTypeTraits<unsigned_long>,(unsigned_char)6,false,google::protobuf::internal::RepeatedPrimitiveTypeTraits<unsigned_long>>
                   (message,(ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::RepeatedPrimitiveTypeTraits<unsigned_long>,_(unsigned_char)__x06_,_false>
                             *)proto2_unittest::repeated_fixed64_extension);
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              ((EqHelper *)local_1068,"0",
               "message.ExtensionSize(Traits::repeated_fixed64_extension)",local_1070 + 1,local_1070
              );
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1068);
    if (!bVar1) {
      testing::Message::Message(&local_1078);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1068);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_37.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xcc6,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_37.message_,&local_1078);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_37.message_);
      testing::Message::~Message(&local_1078);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_1068);
    local_1098[1] = 0;
    local_1098[0] =
         proto2_unittest::TestAllExtensions::
         ExtensionSize<google::protobuf::internal::RepeatedPrimitiveTypeTraits<int>,(unsigned_char)15,false,google::protobuf::internal::RepeatedPrimitiveTypeTraits<int>>
                   (message,(ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::RepeatedPrimitiveTypeTraits<int>,_(unsigned_char)__x0f_,_false>
                             *)&proto2_unittest::repeated_sfixed32_extension);
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              ((EqHelper *)local_1090,"0",
               "message.ExtensionSize(Traits::repeated_sfixed32_extension)",local_1098 + 1,
               local_1098);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1090);
    if (!bVar1) {
      testing::Message::Message(&local_10a0);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1090);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_38.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xcc7,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_38.message_,&local_10a0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_38.message_);
      testing::Message::~Message(&local_10a0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_1090);
    local_10c0[1] = 0;
    local_10c0[0] =
         proto2_unittest::TestAllExtensions::
         ExtensionSize<google::protobuf::internal::RepeatedPrimitiveTypeTraits<long>,(unsigned_char)16,false,google::protobuf::internal::RepeatedPrimitiveTypeTraits<long>>
                   (message,(ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::RepeatedPrimitiveTypeTraits<long>,_(unsigned_char)__x10_,_false>
                             *)proto2_unittest::repeated_sfixed64_extension);
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              ((EqHelper *)local_10b8,"0",
               "message.ExtensionSize(Traits::repeated_sfixed64_extension)",local_10c0 + 1,
               local_10c0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_10b8);
    if (!bVar1) {
      testing::Message::Message(&local_10c8);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_10b8);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_39.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xcc8,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_39.message_,&local_10c8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_39.message_);
      testing::Message::~Message(&local_10c8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_10b8);
    local_10e8[1] = 0;
    local_10e8[0] =
         proto2_unittest::TestAllExtensions::
         ExtensionSize<google::protobuf::internal::RepeatedPrimitiveTypeTraits<float>,(unsigned_char)2,false,google::protobuf::internal::RepeatedPrimitiveTypeTraits<float>>
                   (message,(ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::RepeatedPrimitiveTypeTraits<float>,_(unsigned_char)__x02_,_false>
                             *)&proto2_unittest::repeated_float_extension);
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              ((EqHelper *)local_10e0,"0","message.ExtensionSize(Traits::repeated_float_extension)",
               local_10e8 + 1,local_10e8);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_10e0);
    if (!bVar1) {
      testing::Message::Message(&local_10f0);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_10e0);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_40.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xcc9,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_40.message_,&local_10f0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_40.message_);
      testing::Message::~Message(&local_10f0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_10e0);
    local_1110[1] = 0;
    local_1110[0] =
         proto2_unittest::TestAllExtensions::
         ExtensionSize<google::protobuf::internal::RepeatedPrimitiveTypeTraits<double>,(unsigned_char)1,false,google::protobuf::internal::RepeatedPrimitiveTypeTraits<double>>
                   (message,(ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::RepeatedPrimitiveTypeTraits<double>,_(unsigned_char)__x01_,_false>
                             *)proto2_unittest::repeated_double_extension);
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              ((EqHelper *)local_1108,"0","message.ExtensionSize(Traits::repeated_double_extension)"
               ,local_1110 + 1,local_1110);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1108);
    if (!bVar1) {
      testing::Message::Message(&local_1118);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1108);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_41.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xcca,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_41.message_,&local_1118);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_41.message_);
      testing::Message::~Message(&local_1118);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_1108);
    local_1138[1] = 0;
    local_1138[0] =
         proto2_unittest::TestAllExtensions::
         ExtensionSize<google::protobuf::internal::RepeatedPrimitiveTypeTraits<bool>,(unsigned_char)8,false,google::protobuf::internal::RepeatedPrimitiveTypeTraits<bool>>
                   (message,(ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::RepeatedPrimitiveTypeTraits<bool>,_(unsigned_char)__b_,_false>
                             *)&proto2_unittest::repeated_bool_extension);
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              ((EqHelper *)local_1130,"0","message.ExtensionSize(Traits::repeated_bool_extension)",
               local_1138 + 1,local_1138);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1130);
    if (!bVar1) {
      testing::Message::Message(&local_1140);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1130);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_42.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xccb,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_42.message_,&local_1140);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_42.message_);
      testing::Message::~Message(&local_1140);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_1130);
    local_1160[1] = 0;
    local_1160[0] =
         proto2_unittest::TestAllExtensions::
         ExtensionSize<google::protobuf::internal::RepeatedStringTypeTraits,(unsigned_char)12,false,google::protobuf::internal::RepeatedStringTypeTraits>
                   (message,(ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::RepeatedStringTypeTraits,_(unsigned_char)__f_,_false>
                             *)proto2_unittest::repeated_string_extension);
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              ((EqHelper *)local_1158,"0","message.ExtensionSize(Traits::repeated_string_extension)"
               ,local_1160 + 1,local_1160);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1158);
    if (!bVar1) {
      testing::Message::Message(&local_1168);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1158);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_43.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xccc,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_43.message_,&local_1168);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_43.message_);
      testing::Message::~Message(&local_1168);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_1158);
    local_1188[1] = 0;
    local_1188[0] =
         proto2_unittest::TestAllExtensions::
         ExtensionSize<google::protobuf::internal::RepeatedStringTypeTraits,(unsigned_char)12,false,google::protobuf::internal::RepeatedStringTypeTraits>
                   (message,(ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::RepeatedStringTypeTraits,_(unsigned_char)__f_,_false>
                             *)proto2_unittest::repeated_bytes_extension);
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              ((EqHelper *)local_1180,"0","message.ExtensionSize(Traits::repeated_bytes_extension)",
               local_1188 + 1,local_1188);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1180);
    if (!bVar1) {
      testing::Message::Message(&local_1190);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1180);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_44.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xccd,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_44.message_,&local_1190);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_44.message_);
      testing::Message::~Message(&local_1190);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_1180);
    local_11b0[1] = 0;
    local_11b0[0] =
         proto2_unittest::TestAllExtensions::
         ExtensionSize<google::protobuf::internal::RepeatedMessageTypeTraits<proto2_unittest::RepeatedGroup_extension>,(unsigned_char)10,false,google::protobuf::internal::RepeatedMessageTypeTraits<proto2_unittest::RepeatedGroup_extension>>
                   (message,(ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::RepeatedMessageTypeTraits<proto2_unittest::RepeatedGroup_extension>,_(unsigned_char)__n_,_false>
                             *)proto2_unittest::repeatedgroup_extension);
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              ((EqHelper *)local_11a8,"0","message.ExtensionSize(Traits::repeatedgroup_extension)",
               local_11b0 + 1,local_11b0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_11a8);
    if (!bVar1) {
      testing::Message::Message(&local_11b8);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_11a8);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_45.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xccf,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_45.message_,&local_11b8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_45.message_);
      testing::Message::~Message(&local_11b8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_11a8);
    local_11d8[1] = 0;
    local_11d8[0] =
         proto2_unittest::TestAllExtensions::
         ExtensionSize<google::protobuf::internal::RepeatedMessageTypeTraits<proto2_unittest::TestAllTypes_NestedMessage>,(unsigned_char)11,false,google::protobuf::internal::RepeatedMessageTypeTraits<proto2_unittest::TestAllTypes_NestedMessage>>
                   (message,(ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::RepeatedMessageTypeTraits<proto2_unittest::TestAllTypes_NestedMessage>,_(unsigned_char)__v_,_false>
                             *)proto2_unittest::repeated_nested_message_extension);
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              ((EqHelper *)local_11d0,"0",
               "message.ExtensionSize(Traits::repeated_nested_message_extension)",local_11d8 + 1,
               local_11d8);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_11d0);
    if (!bVar1) {
      testing::Message::Message(&local_11e0);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_11d0);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_46.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xcd1,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_46.message_,&local_11e0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_46.message_);
      testing::Message::~Message(&local_11e0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_11d0);
    local_1200[1] = 0;
    local_1200[0] =
         proto2_unittest::TestAllExtensions::
         ExtensionSize<google::protobuf::internal::RepeatedMessageTypeTraits<proto2_unittest::ForeignMessage>,(unsigned_char)11,false,google::protobuf::internal::RepeatedMessageTypeTraits<proto2_unittest::ForeignMessage>>
                   (message,(ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::RepeatedMessageTypeTraits<proto2_unittest::ForeignMessage>,_(unsigned_char)__v_,_false>
                             *)proto2_unittest::repeated_foreign_message_extension);
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              ((EqHelper *)local_11f8,"0",
               "message.ExtensionSize(Traits::repeated_foreign_message_extension)",local_1200 + 1,
               local_1200);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_11f8);
    if (!bVar1) {
      testing::Message::Message(&local_1208);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_11f8);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_47.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xcd3,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_47.message_,&local_1208);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_47.message_);
      testing::Message::~Message(&local_1208);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_11f8);
    local_1228[1] = 0;
    local_1228[0] =
         proto2_unittest::TestAllExtensions::
         ExtensionSize<google::protobuf::internal::RepeatedMessageTypeTraits<proto2_unittest_import::ImportMessage>,(unsigned_char)11,false,google::protobuf::internal::RepeatedMessageTypeTraits<proto2_unittest_import::ImportMessage>>
                   (message,(ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::RepeatedMessageTypeTraits<proto2_unittest_import::ImportMessage>,_(unsigned_char)__v_,_false>
                             *)proto2_unittest::repeated_import_message_extension);
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              ((EqHelper *)local_1220,"0",
               "message.ExtensionSize(Traits::repeated_import_message_extension)",local_1228 + 1,
               local_1228);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1220);
    if (!bVar1) {
      testing::Message::Message(&local_1230);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1220);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_48.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xcd5,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_48.message_,&local_1230);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_48.message_);
      testing::Message::~Message(&local_1230);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_1220);
    local_1250[1] = 0;
    local_1250[0] =
         proto2_unittest::TestAllExtensions::
         ExtensionSize<google::protobuf::internal::RepeatedMessageTypeTraits<proto2_unittest::TestAllTypes_NestedMessage>,(unsigned_char)11,false,google::protobuf::internal::RepeatedMessageTypeTraits<proto2_unittest::TestAllTypes_NestedMessage>>
                   (message,(ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::RepeatedMessageTypeTraits<proto2_unittest::TestAllTypes_NestedMessage>,_(unsigned_char)__v_,_false>
                             *)proto2_unittest::repeated_lazy_message_extension);
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              ((EqHelper *)local_1248,"0",
               "message.ExtensionSize(Traits::repeated_lazy_message_extension)",local_1250 + 1,
               local_1250);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1248);
    if (!bVar1) {
      testing::Message::Message(&local_1258);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1248);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_49.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xcd6,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_49.message_,&local_1258);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_49.message_);
      testing::Message::~Message(&local_1258);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_1248);
    local_1278[1] = 0;
    local_1278[0] =
         proto2_unittest::TestAllExtensions::
         ExtensionSize<google::protobuf::internal::RepeatedEnumTypeTraits<proto2_unittest::TestAllTypes_NestedEnum>,(unsigned_char)14,false,google::protobuf::internal::RepeatedEnumTypeTraits<proto2_unittest::TestAllTypes_NestedEnum>>
                   (message,(ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::RepeatedEnumTypeTraits<proto2_unittest::TestAllTypes_NestedEnum>,_(unsigned_char)__x0e_,_false>
                             *)&proto2_unittest::repeated_nested_enum_extension);
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              ((EqHelper *)local_1270,"0",
               "message.ExtensionSize(Traits::repeated_nested_enum_extension)",local_1278 + 1,
               local_1278);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1270);
    if (!bVar1) {
      testing::Message::Message(&local_1280);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1270);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_50.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xcd7,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_50.message_,&local_1280);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_50.message_);
      testing::Message::~Message(&local_1280);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_1270);
    local_12a0[1] = 0;
    local_12a0[0] =
         proto2_unittest::TestAllExtensions::
         ExtensionSize<google::protobuf::internal::RepeatedEnumTypeTraits<proto2_unittest::ForeignEnum>,(unsigned_char)14,false,google::protobuf::internal::RepeatedEnumTypeTraits<proto2_unittest::ForeignEnum>>
                   (message,(ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::RepeatedEnumTypeTraits<proto2_unittest::ForeignEnum>,_(unsigned_char)__x0e_,_false>
                             *)&proto2_unittest::repeated_foreign_enum_extension);
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              ((EqHelper *)local_1298,"0",
               "message.ExtensionSize(Traits::repeated_foreign_enum_extension)",local_12a0 + 1,
               local_12a0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1298);
    if (!bVar1) {
      testing::Message::Message(&local_12a8);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1298);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_51.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xcd8,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_51.message_,&local_12a8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_51.message_);
      testing::Message::~Message(&local_12a8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_1298);
    local_12c8[1] = 0;
    local_12c8[0] =
         proto2_unittest::TestAllExtensions::
         ExtensionSize<google::protobuf::internal::RepeatedEnumTypeTraits<proto2_unittest_import::ImportEnum>,(unsigned_char)14,false,google::protobuf::internal::RepeatedEnumTypeTraits<proto2_unittest_import::ImportEnum>>
                   (message,(ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::RepeatedEnumTypeTraits<proto2_unittest_import::ImportEnum>,_(unsigned_char)__x0e_,_false>
                             *)&proto2_unittest::repeated_import_enum_extension);
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              ((EqHelper *)local_12c0,"0",
               "message.ExtensionSize(Traits::repeated_import_enum_extension)",local_12c8 + 1,
               local_12c8);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_12c0);
    if (!bVar1) {
      testing::Message::Message(&local_12d0);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_12c0);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_52.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xcd9,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_52.message_,&local_12d0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_52.message_);
      testing::Message::~Message(&local_12d0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_12c0);
    local_12f0[1] = 0;
    local_12f0[0] =
         proto2_unittest::TestAllExtensions::
         ExtensionSize<google::protobuf::internal::RepeatedStringTypeTraits,(unsigned_char)12,false,google::protobuf::internal::RepeatedStringTypeTraits>
                   (message,(ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::RepeatedStringTypeTraits,_(unsigned_char)__f_,_false>
                             *)proto2_unittest::repeated_string_piece_extension);
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              ((EqHelper *)local_12e8,"0",
               "message.ExtensionSize(Traits::repeated_string_piece_extension)",local_12f0 + 1,
               local_12f0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_12e8);
    if (!bVar1) {
      testing::Message::Message(&local_12f8);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_12e8);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_53.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xcdb,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_53.message_,&local_12f8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_53.message_);
      testing::Message::~Message(&local_12f8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_12e8);
    local_1318[1] = 0;
    local_1318[0] =
         proto2_unittest::TestAllExtensions::
         ExtensionSize<google::protobuf::internal::RepeatedStringTypeTraits,(unsigned_char)12,false,google::protobuf::internal::RepeatedStringTypeTraits>
                   (message,(ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::RepeatedStringTypeTraits,_(unsigned_char)__f_,_false>
                             *)proto2_unittest::repeated_cord_extension);
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              ((EqHelper *)local_1310,"0","message.ExtensionSize(Traits::repeated_cord_extension)",
               local_1318 + 1,local_1318);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1310);
    if (!bVar1) {
      testing::Message::Message(&local_1320);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1310);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar__37.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xcdc,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__37.message_,&local_1320)
      ;
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__37.message_);
      testing::Message::~Message(&local_1320);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_1310);
    bVar1 = proto2_unittest::TestAllExtensions::
            HasExtension<google::protobuf::internal::PrimitiveTypeTraits<int>,(unsigned_char)5,false,google::protobuf::internal::PrimitiveTypeTraits<int>>
                      (message,(ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::PrimitiveTypeTraits<int>,_(unsigned_char)__x05_,_false>
                                *)&proto2_unittest::default_int32_extension);
    local_1339 = (bool)(~bVar1 & 1);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_1338,&local_1339,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1338);
    if (!bVar1) {
      testing::Message::Message(&local_1348);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar__38.message_,(internal *)local_1338,
                 (AssertionResult *)"message.HasExtension(Traits::default_int32_extension)","true",
                 "false",in_R9);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_1350,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xcdf,pcVar3);
      testing::internal::AssertHelper::operator=(&local_1350,&local_1348);
      testing::internal::AssertHelper::~AssertHelper(&local_1350);
      std::__cxx11::string::~string((string *)&gtest_ar__38.message_);
      testing::Message::~Message(&local_1348);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_1338);
    bVar1 = proto2_unittest::TestAllExtensions::
            HasExtension<google::protobuf::internal::PrimitiveTypeTraits<long>,(unsigned_char)3,false,google::protobuf::internal::PrimitiveTypeTraits<long>>
                      (message,(ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::PrimitiveTypeTraits<long>,_(unsigned_char)__x03_,_false>
                                *)proto2_unittest::default_int64_extension);
    local_1381 = (bool)(~bVar1 & 1);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_1380,&local_1381,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1380);
    if (!bVar1) {
      testing::Message::Message(&local_1390);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar__39.message_,(internal *)local_1380,
                 (AssertionResult *)"message.HasExtension(Traits::default_int64_extension)","true",
                 "false",in_R9);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_1398,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xce0,pcVar3);
      testing::internal::AssertHelper::operator=(&local_1398,&local_1390);
      testing::internal::AssertHelper::~AssertHelper(&local_1398);
      std::__cxx11::string::~string((string *)&gtest_ar__39.message_);
      testing::Message::~Message(&local_1390);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_1380);
    bVar1 = proto2_unittest::TestAllExtensions::
            HasExtension<google::protobuf::internal::PrimitiveTypeTraits<unsigned_int>,(unsigned_char)13,false,google::protobuf::internal::PrimitiveTypeTraits<unsigned_int>>
                      (message,(ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::PrimitiveTypeTraits<unsigned_int>,_(unsigned_char)__r_,_false>
                                *)&proto2_unittest::default_uint32_extension);
    local_13c9 = (bool)(~bVar1 & 1);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_13c8,&local_13c9,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_13c8);
    if (!bVar1) {
      testing::Message::Message(&local_13d8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar__40.message_,(internal *)local_13c8,
                 (AssertionResult *)"message.HasExtension(Traits::default_uint32_extension)","true",
                 "false",in_R9);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_13e0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xce1,pcVar3);
      testing::internal::AssertHelper::operator=(&local_13e0,&local_13d8);
      testing::internal::AssertHelper::~AssertHelper(&local_13e0);
      std::__cxx11::string::~string((string *)&gtest_ar__40.message_);
      testing::Message::~Message(&local_13d8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_13c8);
    bVar1 = proto2_unittest::TestAllExtensions::
            HasExtension<google::protobuf::internal::PrimitiveTypeTraits<unsigned_long>,(unsigned_char)4,false,google::protobuf::internal::PrimitiveTypeTraits<unsigned_long>>
                      (message,(ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::PrimitiveTypeTraits<unsigned_long>,_(unsigned_char)__x04_,_false>
                                *)proto2_unittest::default_uint64_extension);
    local_1411 = (bool)(~bVar1 & 1);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_1410,&local_1411,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1410);
    if (!bVar1) {
      testing::Message::Message(&local_1420);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar__41.message_,(internal *)local_1410,
                 (AssertionResult *)"message.HasExtension(Traits::default_uint64_extension)","true",
                 "false",in_R9);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_1428,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xce2,pcVar3);
      testing::internal::AssertHelper::operator=(&local_1428,&local_1420);
      testing::internal::AssertHelper::~AssertHelper(&local_1428);
      std::__cxx11::string::~string((string *)&gtest_ar__41.message_);
      testing::Message::~Message(&local_1420);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_1410);
    bVar1 = proto2_unittest::TestAllExtensions::
            HasExtension<google::protobuf::internal::PrimitiveTypeTraits<int>,(unsigned_char)17,false,google::protobuf::internal::PrimitiveTypeTraits<int>>
                      (message,(ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::PrimitiveTypeTraits<int>,_(unsigned_char)__x11_,_false>
                                *)&proto2_unittest::default_sint32_extension);
    local_1459 = (bool)(~bVar1 & 1);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_1458,&local_1459,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1458);
    if (!bVar1) {
      testing::Message::Message(&local_1468);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar__42.message_,(internal *)local_1458,
                 (AssertionResult *)"message.HasExtension(Traits::default_sint32_extension)","true",
                 "false",in_R9);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_1470,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xce3,pcVar3);
      testing::internal::AssertHelper::operator=(&local_1470,&local_1468);
      testing::internal::AssertHelper::~AssertHelper(&local_1470);
      std::__cxx11::string::~string((string *)&gtest_ar__42.message_);
      testing::Message::~Message(&local_1468);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_1458);
    bVar1 = proto2_unittest::TestAllExtensions::
            HasExtension<google::protobuf::internal::PrimitiveTypeTraits<long>,(unsigned_char)18,false,google::protobuf::internal::PrimitiveTypeTraits<long>>
                      (message,(ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::PrimitiveTypeTraits<long>,_(unsigned_char)__x12_,_false>
                                *)proto2_unittest::default_sint64_extension);
    local_14a1 = (bool)(~bVar1 & 1);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_14a0,&local_14a1,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_14a0);
    if (!bVar1) {
      testing::Message::Message(&local_14b0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar__43.message_,(internal *)local_14a0,
                 (AssertionResult *)"message.HasExtension(Traits::default_sint64_extension)","true",
                 "false",in_R9);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_14b8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xce4,pcVar3);
      testing::internal::AssertHelper::operator=(&local_14b8,&local_14b0);
      testing::internal::AssertHelper::~AssertHelper(&local_14b8);
      std::__cxx11::string::~string((string *)&gtest_ar__43.message_);
      testing::Message::~Message(&local_14b0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_14a0);
    bVar1 = proto2_unittest::TestAllExtensions::
            HasExtension<google::protobuf::internal::PrimitiveTypeTraits<unsigned_int>,(unsigned_char)7,false,google::protobuf::internal::PrimitiveTypeTraits<unsigned_int>>
                      (message,(ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::PrimitiveTypeTraits<unsigned_int>,_(unsigned_char)__a_,_false>
                                *)&proto2_unittest::default_fixed32_extension);
    local_14e9 = (bool)(~bVar1 & 1);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_14e8,&local_14e9,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_14e8);
    if (!bVar1) {
      testing::Message::Message(&local_14f8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar__44.message_,(internal *)local_14e8,
                 (AssertionResult *)"message.HasExtension(Traits::default_fixed32_extension)","true"
                 ,"false",in_R9);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_1500,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xce5,pcVar3);
      testing::internal::AssertHelper::operator=(&local_1500,&local_14f8);
      testing::internal::AssertHelper::~AssertHelper(&local_1500);
      std::__cxx11::string::~string((string *)&gtest_ar__44.message_);
      testing::Message::~Message(&local_14f8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_14e8);
    bVar1 = proto2_unittest::TestAllExtensions::
            HasExtension<google::protobuf::internal::PrimitiveTypeTraits<unsigned_long>,(unsigned_char)6,false,google::protobuf::internal::PrimitiveTypeTraits<unsigned_long>>
                      (message,(ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::PrimitiveTypeTraits<unsigned_long>,_(unsigned_char)__x06_,_false>
                                *)proto2_unittest::default_fixed64_extension);
    local_1531 = (bool)(~bVar1 & 1);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_1530,&local_1531,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1530);
    if (!bVar1) {
      testing::Message::Message(&local_1540);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar__45.message_,(internal *)local_1530,
                 (AssertionResult *)"message.HasExtension(Traits::default_fixed64_extension)","true"
                 ,"false",in_R9);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_1548,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xce6,pcVar3);
      testing::internal::AssertHelper::operator=(&local_1548,&local_1540);
      testing::internal::AssertHelper::~AssertHelper(&local_1548);
      std::__cxx11::string::~string((string *)&gtest_ar__45.message_);
      testing::Message::~Message(&local_1540);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_1530);
    bVar1 = proto2_unittest::TestAllExtensions::
            HasExtension<google::protobuf::internal::PrimitiveTypeTraits<int>,(unsigned_char)15,false,google::protobuf::internal::PrimitiveTypeTraits<int>>
                      (message,(ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::PrimitiveTypeTraits<int>,_(unsigned_char)__x0f_,_false>
                                *)&proto2_unittest::default_sfixed32_extension);
    local_1579 = (bool)(~bVar1 & 1);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_1578,&local_1579,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1578);
    if (!bVar1) {
      testing::Message::Message(&local_1588);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar__46.message_,(internal *)local_1578,
                 (AssertionResult *)"message.HasExtension(Traits::default_sfixed32_extension)",
                 "true","false",in_R9);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_1590,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xce7,pcVar3);
      testing::internal::AssertHelper::operator=(&local_1590,&local_1588);
      testing::internal::AssertHelper::~AssertHelper(&local_1590);
      std::__cxx11::string::~string((string *)&gtest_ar__46.message_);
      testing::Message::~Message(&local_1588);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_1578);
    bVar1 = proto2_unittest::TestAllExtensions::
            HasExtension<google::protobuf::internal::PrimitiveTypeTraits<long>,(unsigned_char)16,false,google::protobuf::internal::PrimitiveTypeTraits<long>>
                      (message,(ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::PrimitiveTypeTraits<long>,_(unsigned_char)__x10_,_false>
                                *)proto2_unittest::default_sfixed64_extension);
    local_15c1 = (bool)(~bVar1 & 1);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_15c0,&local_15c1,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_15c0);
    if (!bVar1) {
      testing::Message::Message(&local_15d0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar__47.message_,(internal *)local_15c0,
                 (AssertionResult *)"message.HasExtension(Traits::default_sfixed64_extension)",
                 "true","false",in_R9);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_15d8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xce8,pcVar3);
      testing::internal::AssertHelper::operator=(&local_15d8,&local_15d0);
      testing::internal::AssertHelper::~AssertHelper(&local_15d8);
      std::__cxx11::string::~string((string *)&gtest_ar__47.message_);
      testing::Message::~Message(&local_15d0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_15c0);
    bVar1 = proto2_unittest::TestAllExtensions::
            HasExtension<google::protobuf::internal::PrimitiveTypeTraits<float>,(unsigned_char)2,false,google::protobuf::internal::PrimitiveTypeTraits<float>>
                      (message,(ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::PrimitiveTypeTraits<float>,_(unsigned_char)__x02_,_false>
                                *)&proto2_unittest::default_float_extension);
    local_1609 = (bool)(~bVar1 & 1);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_1608,&local_1609,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1608);
    if (!bVar1) {
      testing::Message::Message(&local_1618);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar__48.message_,(internal *)local_1608,
                 (AssertionResult *)"message.HasExtension(Traits::default_float_extension)","true",
                 "false",in_R9);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_1620,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xce9,pcVar3);
      testing::internal::AssertHelper::operator=(&local_1620,&local_1618);
      testing::internal::AssertHelper::~AssertHelper(&local_1620);
      std::__cxx11::string::~string((string *)&gtest_ar__48.message_);
      testing::Message::~Message(&local_1618);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_1608);
    bVar1 = proto2_unittest::TestAllExtensions::
            HasExtension<google::protobuf::internal::PrimitiveTypeTraits<double>,(unsigned_char)1,false,google::protobuf::internal::PrimitiveTypeTraits<double>>
                      (message,(ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::PrimitiveTypeTraits<double>,_(unsigned_char)__x01_,_false>
                                *)proto2_unittest::default_double_extension);
    local_1651 = (bool)(~bVar1 & 1);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_1650,&local_1651,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1650);
    if (!bVar1) {
      testing::Message::Message(&local_1660);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar__49.message_,(internal *)local_1650,
                 (AssertionResult *)"message.HasExtension(Traits::default_double_extension)","true",
                 "false",in_R9);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_1668,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xcea,pcVar3);
      testing::internal::AssertHelper::operator=(&local_1668,&local_1660);
      testing::internal::AssertHelper::~AssertHelper(&local_1668);
      std::__cxx11::string::~string((string *)&gtest_ar__49.message_);
      testing::Message::~Message(&local_1660);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_1650);
    bVar1 = proto2_unittest::TestAllExtensions::
            HasExtension<google::protobuf::internal::PrimitiveTypeTraits<bool>,(unsigned_char)8,false,google::protobuf::internal::PrimitiveTypeTraits<bool>>
                      (message,(ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::PrimitiveTypeTraits<bool>,_(unsigned_char)__b_,_false>
                                *)&proto2_unittest::default_bool_extension);
    local_1699 = (bool)(~bVar1 & 1);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_1698,&local_1699,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1698);
    if (!bVar1) {
      testing::Message::Message(&local_16a8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar__50.message_,(internal *)local_1698,
                 (AssertionResult *)"message.HasExtension(Traits::default_bool_extension)","true",
                 "false",in_R9);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_16b0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xceb,pcVar3);
      testing::internal::AssertHelper::operator=(&local_16b0,&local_16a8);
      testing::internal::AssertHelper::~AssertHelper(&local_16b0);
      std::__cxx11::string::~string((string *)&gtest_ar__50.message_);
      testing::Message::~Message(&local_16a8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_1698);
    bVar1 = proto2_unittest::TestAllExtensions::
            HasExtension<google::protobuf::internal::StringTypeTraits,(unsigned_char)12,false,google::protobuf::internal::StringTypeTraits>
                      (message,(ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::StringTypeTraits,_(unsigned_char)__f_,_false>
                                *)proto2_unittest::default_string_extension);
    local_16e1 = (bool)(~bVar1 & 1);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_16e0,&local_16e1,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_16e0);
    if (!bVar1) {
      testing::Message::Message(&local_16f0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar__51.message_,(internal *)local_16e0,
                 (AssertionResult *)"message.HasExtension(Traits::default_string_extension)","true",
                 "false",in_R9);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_16f8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xcec,pcVar3);
      testing::internal::AssertHelper::operator=(&local_16f8,&local_16f0);
      testing::internal::AssertHelper::~AssertHelper(&local_16f8);
      std::__cxx11::string::~string((string *)&gtest_ar__51.message_);
      testing::Message::~Message(&local_16f0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_16e0);
    bVar1 = proto2_unittest::TestAllExtensions::
            HasExtension<google::protobuf::internal::StringTypeTraits,(unsigned_char)12,false,google::protobuf::internal::StringTypeTraits>
                      (message,(ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::StringTypeTraits,_(unsigned_char)__f_,_false>
                                *)proto2_unittest::default_bytes_extension);
    local_1729 = (bool)(~bVar1 & 1);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_1728,&local_1729,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1728);
    if (!bVar1) {
      testing::Message::Message(&local_1738);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar__52.message_,(internal *)local_1728,
                 (AssertionResult *)"message.HasExtension(Traits::default_bytes_extension)","true",
                 "false",in_R9);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_1740,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xced,pcVar3);
      testing::internal::AssertHelper::operator=(&local_1740,&local_1738);
      testing::internal::AssertHelper::~AssertHelper(&local_1740);
      std::__cxx11::string::~string((string *)&gtest_ar__52.message_);
      testing::Message::~Message(&local_1738);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_1728);
    bVar1 = proto2_unittest::TestAllExtensions::
            HasExtension<google::protobuf::internal::EnumTypeTraits<proto2_unittest::TestAllTypes_NestedEnum>,(unsigned_char)14,false,google::protobuf::internal::EnumTypeTraits<proto2_unittest::TestAllTypes_NestedEnum>>
                      (message,(ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::EnumTypeTraits<proto2_unittest::TestAllTypes_NestedEnum>,_(unsigned_char)__x0e_,_false>
                                *)&proto2_unittest::default_nested_enum_extension);
    local_1771 = (bool)(~bVar1 & 1);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_1770,&local_1771,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1770);
    if (!bVar1) {
      testing::Message::Message(&local_1780);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar__53.message_,(internal *)local_1770,
                 (AssertionResult *)"message.HasExtension(Traits::default_nested_enum_extension)",
                 "true","false",in_R9);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_1788,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xcef,pcVar3);
      testing::internal::AssertHelper::operator=(&local_1788,&local_1780);
      testing::internal::AssertHelper::~AssertHelper(&local_1788);
      std::__cxx11::string::~string((string *)&gtest_ar__53.message_);
      testing::Message::~Message(&local_1780);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_1770);
    bVar1 = proto2_unittest::TestAllExtensions::
            HasExtension<google::protobuf::internal::EnumTypeTraits<proto2_unittest::ForeignEnum>,(unsigned_char)14,false,google::protobuf::internal::EnumTypeTraits<proto2_unittest::ForeignEnum>>
                      (message,(ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::EnumTypeTraits<proto2_unittest::ForeignEnum>,_(unsigned_char)__x0e_,_false>
                                *)&proto2_unittest::default_foreign_enum_extension);
    local_17b9 = (bool)(~bVar1 & 1);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_17b8,&local_17b9,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_17b8);
    if (!bVar1) {
      testing::Message::Message(&local_17c8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar__54.message_,(internal *)local_17b8,
                 (AssertionResult *)"message.HasExtension(Traits::default_foreign_enum_extension)",
                 "true","false",in_R9);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_17d0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xcf0,pcVar3);
      testing::internal::AssertHelper::operator=(&local_17d0,&local_17c8);
      testing::internal::AssertHelper::~AssertHelper(&local_17d0);
      std::__cxx11::string::~string((string *)&gtest_ar__54.message_);
      testing::Message::~Message(&local_17c8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_17b8);
    bVar1 = proto2_unittest::TestAllExtensions::
            HasExtension<google::protobuf::internal::EnumTypeTraits<proto2_unittest_import::ImportEnum>,(unsigned_char)14,false,google::protobuf::internal::EnumTypeTraits<proto2_unittest_import::ImportEnum>>
                      (message,(ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::EnumTypeTraits<proto2_unittest_import::ImportEnum>,_(unsigned_char)__x0e_,_false>
                                *)&proto2_unittest::default_import_enum_extension);
    local_1801 = (bool)(~bVar1 & 1);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_1800,&local_1801,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1800);
    if (!bVar1) {
      testing::Message::Message(&local_1810);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar__55.message_,(internal *)local_1800,
                 (AssertionResult *)"message.HasExtension(Traits::default_import_enum_extension)",
                 "true","false",in_R9);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_1818,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xcf1,pcVar3);
      testing::internal::AssertHelper::operator=(&local_1818,&local_1810);
      testing::internal::AssertHelper::~AssertHelper(&local_1818);
      std::__cxx11::string::~string((string *)&gtest_ar__55.message_);
      testing::Message::~Message(&local_1810);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_1800);
    bVar1 = proto2_unittest::TestAllExtensions::
            HasExtension<google::protobuf::internal::StringTypeTraits,(unsigned_char)12,false,google::protobuf::internal::StringTypeTraits>
                      (message,(ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::StringTypeTraits,_(unsigned_char)__f_,_false>
                                *)proto2_unittest::default_string_piece_extension);
    local_1849 = (bool)(~bVar1 & 1);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_1848,&local_1849,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1848);
    if (!bVar1) {
      testing::Message::Message(&local_1858);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar__56.message_,(internal *)local_1848,
                 (AssertionResult *)"message.HasExtension(Traits::default_string_piece_extension)",
                 "true","false",in_R9);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_1860,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xcf3,pcVar3);
      testing::internal::AssertHelper::operator=(&local_1860,&local_1858);
      testing::internal::AssertHelper::~AssertHelper(&local_1860);
      std::__cxx11::string::~string((string *)&gtest_ar__56.message_);
      testing::Message::~Message(&local_1858);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_1848);
    bVar1 = proto2_unittest::TestAllExtensions::
            HasExtension<google::protobuf::internal::StringTypeTraits,(unsigned_char)12,false,google::protobuf::internal::StringTypeTraits>
                      (message,(ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::StringTypeTraits,_(unsigned_char)__f_,_false>
                                *)proto2_unittest::default_cord_extension);
    local_1891 = (bool)(~bVar1 & 1);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_1890,&local_1891,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1890);
    if (!bVar1) {
      testing::Message::Message(&local_18a0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar_54.message_,(internal *)local_1890,
                 (AssertionResult *)"message.HasExtension(Traits::default_cord_extension)","true",
                 "false",in_R9);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_18a8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xcf4,pcVar3);
      testing::internal::AssertHelper::operator=(&local_18a8,&local_18a0);
      testing::internal::AssertHelper::~AssertHelper(&local_18a8);
      std::__cxx11::string::~string((string *)&gtest_ar_54.message_);
      testing::Message::~Message(&local_18a0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_1890);
    local_18dc = 0x29;
    local_18e0 = proto2_unittest::TestAllExtensions::
                 GetExtension<google::protobuf::internal::PrimitiveTypeTraits<int>,_(unsigned_char)__x05_,_false,_0>
                           (message,(ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::PrimitiveTypeTraits<int>,_(unsigned_char)__x05_,_false>
                                     *)&proto2_unittest::default_int32_extension);
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              ((EqHelper *)local_18d8,"41","message.GetExtension(Traits::default_int32_extension)",
               &local_18dc,&local_18e0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_18d8);
    if (!bVar1) {
      testing::Message::Message(&local_18e8);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_18d8);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_55.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xcf7,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_55.message_,&local_18e8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_55.message_);
      testing::Message::~Message(&local_18e8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_18d8);
    local_1904 = 0x2a;
    local_1910 = proto2_unittest::TestAllExtensions::
                 GetExtension<google::protobuf::internal::PrimitiveTypeTraits<long>,_(unsigned_char)__x03_,_false,_0>
                           (message,(ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::PrimitiveTypeTraits<long>,_(unsigned_char)__x03_,_false>
                                     *)proto2_unittest::default_int64_extension);
    testing::internal::EqHelper::Compare<int,_long,_nullptr>
              ((EqHelper *)local_1900,"42","message.GetExtension(Traits::default_int64_extension)",
               &local_1904,&local_1910);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1900);
    if (!bVar1) {
      testing::Message::Message(&local_1918);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1900);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_56.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xcf8,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_56.message_,&local_1918);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_56.message_);
      testing::Message::~Message(&local_1918);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_1900);
    local_1938[1] = 0x2b;
    local_1938[0] =
         proto2_unittest::TestAllExtensions::
         GetExtension<google::protobuf::internal::PrimitiveTypeTraits<unsigned_int>,_(unsigned_char)__r_,_false,_0>
                   (message,(ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::PrimitiveTypeTraits<unsigned_int>,_(unsigned_char)__r_,_false>
                             *)&proto2_unittest::default_uint32_extension);
    testing::internal::EqHelper::Compare<int,_unsigned_int,_nullptr>
              ((EqHelper *)local_1930,"43","message.GetExtension(Traits::default_uint32_extension)",
               (int *)(local_1938 + 1),local_1938);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1930);
    if (!bVar1) {
      testing::Message::Message(&local_1940);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1930);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_57.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xcf9,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_57.message_,&local_1940);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_57.message_);
      testing::Message::~Message(&local_1940);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_1930);
    local_195c = 0x2c;
    local_1968 = proto2_unittest::TestAllExtensions::
                 GetExtension<google::protobuf::internal::PrimitiveTypeTraits<unsigned_long>,_(unsigned_char)__x04_,_false,_0>
                           (message,(ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::PrimitiveTypeTraits<unsigned_long>,_(unsigned_char)__x04_,_false>
                                     *)proto2_unittest::default_uint64_extension);
    testing::internal::EqHelper::Compare<int,_unsigned_long,_nullptr>
              ((EqHelper *)local_1958,"44","message.GetExtension(Traits::default_uint64_extension)",
               &local_195c,&local_1968);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1958);
    if (!bVar1) {
      testing::Message::Message(&local_1970);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1958);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_58.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xcfa,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_58.message_,&local_1970);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_58.message_);
      testing::Message::~Message(&local_1970);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_1958);
    local_198c = -0x2d;
    local_1990 = proto2_unittest::TestAllExtensions::
                 GetExtension<google::protobuf::internal::PrimitiveTypeTraits<int>,_(unsigned_char)__x11_,_false,_0>
                           (message,(ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::PrimitiveTypeTraits<int>,_(unsigned_char)__x11_,_false>
                                     *)&proto2_unittest::default_sint32_extension);
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              ((EqHelper *)local_1988,"-45","message.GetExtension(Traits::default_sint32_extension)"
               ,&local_198c,&local_1990);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1988);
    if (!bVar1) {
      testing::Message::Message(&local_1998);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1988);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_59.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xcfb,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_59.message_,&local_1998);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_59.message_);
      testing::Message::~Message(&local_1998);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_1988);
    local_19b4 = 0x2e;
    local_19c0 = proto2_unittest::TestAllExtensions::
                 GetExtension<google::protobuf::internal::PrimitiveTypeTraits<long>,_(unsigned_char)__x12_,_false,_0>
                           (message,(ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::PrimitiveTypeTraits<long>,_(unsigned_char)__x12_,_false>
                                     *)proto2_unittest::default_sint64_extension);
    testing::internal::EqHelper::Compare<int,_long,_nullptr>
              ((EqHelper *)local_19b0,"46","message.GetExtension(Traits::default_sint64_extension)",
               &local_19b4,&local_19c0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_19b0);
    if (!bVar1) {
      testing::Message::Message(&local_19c8);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_19b0);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_60.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xcfc,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_60.message_,&local_19c8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_60.message_);
      testing::Message::~Message(&local_19c8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_19b0);
    local_19e8[1] = 0x2f;
    local_19e8[0] =
         proto2_unittest::TestAllExtensions::
         GetExtension<google::protobuf::internal::PrimitiveTypeTraits<unsigned_int>,_(unsigned_char)__a_,_false,_0>
                   (message,(ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::PrimitiveTypeTraits<unsigned_int>,_(unsigned_char)__a_,_false>
                             *)&proto2_unittest::default_fixed32_extension);
    testing::internal::EqHelper::Compare<int,_unsigned_int,_nullptr>
              ((EqHelper *)local_19e0,"47","message.GetExtension(Traits::default_fixed32_extension)"
               ,(int *)(local_19e8 + 1),local_19e8);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_19e0);
    if (!bVar1) {
      testing::Message::Message(&local_19f0);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_19e0);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_61.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xcfd,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_61.message_,&local_19f0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_61.message_);
      testing::Message::~Message(&local_19f0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_19e0);
    local_1a0c = 0x30;
    local_1a18 = proto2_unittest::TestAllExtensions::
                 GetExtension<google::protobuf::internal::PrimitiveTypeTraits<unsigned_long>,_(unsigned_char)__x06_,_false,_0>
                           (message,(ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::PrimitiveTypeTraits<unsigned_long>,_(unsigned_char)__x06_,_false>
                                     *)proto2_unittest::default_fixed64_extension);
    testing::internal::EqHelper::Compare<int,_unsigned_long,_nullptr>
              ((EqHelper *)local_1a08,"48","message.GetExtension(Traits::default_fixed64_extension)"
               ,&local_1a0c,&local_1a18);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1a08);
    if (!bVar1) {
      testing::Message::Message(&local_1a20);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1a08);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_62.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xcfe,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_62.message_,&local_1a20);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_62.message_);
      testing::Message::~Message(&local_1a20);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_1a08);
    local_1a3c = 0x31;
    local_1a40 = proto2_unittest::TestAllExtensions::
                 GetExtension<google::protobuf::internal::PrimitiveTypeTraits<int>,_(unsigned_char)__x0f_,_false,_0>
                           (message,(ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::PrimitiveTypeTraits<int>,_(unsigned_char)__x0f_,_false>
                                     *)&proto2_unittest::default_sfixed32_extension);
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              ((EqHelper *)local_1a38,"49",
               "message.GetExtension(Traits::default_sfixed32_extension)",&local_1a3c,&local_1a40);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1a38);
    if (!bVar1) {
      testing::Message::Message(&local_1a48);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1a38);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_63.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xcff,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_63.message_,&local_1a48);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_63.message_);
      testing::Message::~Message(&local_1a48);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_1a38);
    local_1a64 = -0x32;
    local_1a70 = proto2_unittest::TestAllExtensions::
                 GetExtension<google::protobuf::internal::PrimitiveTypeTraits<long>,_(unsigned_char)__x10_,_false,_0>
                           (message,(ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::PrimitiveTypeTraits<long>,_(unsigned_char)__x10_,_false>
                                     *)proto2_unittest::default_sfixed64_extension);
    testing::internal::EqHelper::Compare<int,_long,_nullptr>
              ((EqHelper *)local_1a60,"-50",
               "message.GetExtension(Traits::default_sfixed64_extension)",&local_1a64,&local_1a70);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1a60);
    if (!bVar1) {
      testing::Message::Message(&local_1a78);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1a60);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_64.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xd00,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_64.message_,&local_1a78);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_64.message_);
      testing::Message::~Message(&local_1a78);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_1a60);
    local_1a98 = 51.5;
    local_1a9c = proto2_unittest::TestAllExtensions::
                 GetExtension<google::protobuf::internal::PrimitiveTypeTraits<float>,_(unsigned_char)__x02_,_false,_0>
                           (message,(ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::PrimitiveTypeTraits<float>,_(unsigned_char)__x02_,_false>
                                     *)&proto2_unittest::default_float_extension);
    testing::internal::EqHelper::Compare<double,_float,_nullptr>
              ((EqHelper *)local_1a90,"51.5","message.GetExtension(Traits::default_float_extension)"
               ,&local_1a98,&local_1a9c);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1a90);
    if (!bVar1) {
      testing::Message::Message(&local_1aa8);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1a90);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_65.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xd01,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_65.message_,&local_1aa8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_65.message_);
      testing::Message::~Message(&local_1aa8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_1a90);
    local_1ac8 = 52000.0;
    local_1ad0 = proto2_unittest::TestAllExtensions::
                 GetExtension<google::protobuf::internal::PrimitiveTypeTraits<double>,_(unsigned_char)__x01_,_false,_0>
                           (message,(ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::PrimitiveTypeTraits<double>,_(unsigned_char)__x01_,_false>
                                     *)proto2_unittest::default_double_extension);
    testing::internal::EqHelper::Compare<double,_double,_nullptr>
              ((EqHelper *)local_1ac0,"52e3",
               "message.GetExtension(Traits::default_double_extension)",&local_1ac8,&local_1ad0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1ac0);
    if (!bVar1) {
      testing::Message::Message(&local_1ad8);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1ac0);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar__57.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xd02,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__57.message_,&local_1ad8)
      ;
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__57.message_);
      testing::Message::~Message(&local_1ad8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_1ac0);
    local_1af1 = proto2_unittest::TestAllExtensions::
                 GetExtension<google::protobuf::internal::PrimitiveTypeTraits<bool>,_(unsigned_char)__b_,_false,_0>
                           (message,(ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::PrimitiveTypeTraits<bool>,_(unsigned_char)__b_,_false>
                                     *)&proto2_unittest::default_bool_extension);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_1af0,&local_1af1,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1af0);
    if (!bVar1) {
      testing::Message::Message(&local_1b00);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar_66.message_,(internal *)local_1af0,
                 (AssertionResult *)"message.GetExtension(Traits::default_bool_extension)","false",
                 "true",in_R9);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_1b08,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xd03,pcVar3);
      testing::internal::AssertHelper::operator=(&local_1b08,&local_1b00);
      testing::internal::AssertHelper::~AssertHelper(&local_1b08);
      std::__cxx11::string::~string((string *)&gtest_ar_66.message_);
      testing::Message::~Message(&local_1b00);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_1af0);
    psVar4 = proto2_unittest::TestAllExtensions::
             GetExtension<google::protobuf::internal::StringTypeTraits,_(unsigned_char)__f_,_false,_0>
                       (message,(ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::StringTypeTraits,_(unsigned_char)__f_,_false>
                                 *)proto2_unittest::default_string_extension);
    testing::internal::EqHelper::
    Compare<char[6],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
              ((EqHelper *)local_1b38,"\"hello\"",
               "message.GetExtension(Traits::default_string_extension)",(char (*) [6])0x1eb200f,
               psVar4);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1b38);
    if (!bVar1) {
      testing::Message::Message(&local_1b40);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1b38);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_67.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xd04,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_67.message_,&local_1b40);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_67.message_);
      testing::Message::~Message(&local_1b40);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_1b38);
    psVar4 = proto2_unittest::TestAllExtensions::
             GetExtension<google::protobuf::internal::StringTypeTraits,_(unsigned_char)__f_,_false,_0>
                       (message,(ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::StringTypeTraits,_(unsigned_char)__f_,_false>
                                 *)proto2_unittest::default_bytes_extension);
    testing::internal::EqHelper::
    Compare<char[6],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
              ((EqHelper *)local_1b58,"\"world\"",
               "message.GetExtension(Traits::default_bytes_extension)",(char (*) [6])0x1ce7f88,
               psVar4);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1b58);
    if (!bVar1) {
      testing::Message::Message(&local_1b60);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1b58);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_68.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xd05,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_68.message_,&local_1b60);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_68.message_);
      testing::Message::~Message(&local_1b60);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_1b58);
    local_1b7c = proto2_unittest::TestAllExtensions::
                 GetExtension<google::protobuf::internal::EnumTypeTraits<proto2_unittest::TestAllTypes_NestedEnum>,_(unsigned_char)__x0e_,_false,_0>
                           (message,(ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::EnumTypeTraits<proto2_unittest::TestAllTypes_NestedEnum>,_(unsigned_char)__x0e_,_false>
                                     *)&proto2_unittest::default_nested_enum_extension);
    testing::internal::EqHelper::
    Compare<proto2_unittest::TestAllTypes_NestedEnum,_proto2_unittest::TestAllTypes_NestedEnum,_nullptr>
              ((EqHelper *)local_1b78,"Traits::TestAllTypes::BAR",
               "message.GetExtension(Traits::default_nested_enum_extension)",
               &proto2_unittest::TestAllTypes::BAR,&local_1b7c);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1b78);
    if (!bVar1) {
      testing::Message::Message(&local_1b88);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1b78);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_69.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xd08,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_69.message_,&local_1b88);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_69.message_);
      testing::Message::~Message(&local_1b88);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_1b78);
    local_1ba4 = proto2_unittest::TestAllExtensions::
                 GetExtension<google::protobuf::internal::EnumTypeTraits<proto2_unittest::ForeignEnum>,_(unsigned_char)__x0e_,_false,_0>
                           (message,(ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::EnumTypeTraits<proto2_unittest::ForeignEnum>,_(unsigned_char)__x0e_,_false>
                                     *)&proto2_unittest::default_foreign_enum_extension);
    testing::internal::EqHelper::
    Compare<proto2_unittest::ForeignEnum,_proto2_unittest::ForeignEnum,_nullptr>
              ((EqHelper *)local_1ba0,"Traits::FOREIGN_BAR",
               "message.GetExtension(Traits::default_foreign_enum_extension)",
               &TestUtilTraits<proto2_unittest::TestAllExtensions>::FOREIGN_BAR,&local_1ba4);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1ba0);
    if (!bVar1) {
      testing::Message::Message(&local_1bb0);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1ba0);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_70.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xd0a,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_70.message_,&local_1bb0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_70.message_);
      testing::Message::~Message(&local_1bb0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_1ba0);
    local_1bcc = proto2_unittest::TestAllExtensions::
                 GetExtension<google::protobuf::internal::EnumTypeTraits<proto2_unittest_import::ImportEnum>,_(unsigned_char)__x0e_,_false,_0>
                           (message,(ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::EnumTypeTraits<proto2_unittest_import::ImportEnum>,_(unsigned_char)__x0e_,_false>
                                     *)&proto2_unittest::default_import_enum_extension);
    testing::internal::EqHelper::
    Compare<proto2_unittest_import::ImportEnum,_proto2_unittest_import::ImportEnum,_nullptr>
              ((EqHelper *)local_1bc8,"Traits::IMPORT_BAR",
               "message.GetExtension(Traits::default_import_enum_extension)",
               &TestUtilTraits<proto2_unittest::TestAllExtensions>::IMPORT_BAR,&local_1bcc);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1bc8);
    if (!bVar1) {
      testing::Message::Message(&local_1bd8);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1bc8);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_71.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xd0c,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_71.message_,&local_1bd8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_71.message_);
      testing::Message::~Message(&local_1bd8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_1bc8);
    psVar4 = proto2_unittest::TestAllExtensions::
             GetExtension<google::protobuf::internal::StringTypeTraits,_(unsigned_char)__f_,_false,_0>
                       (message,(ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::StringTypeTraits,_(unsigned_char)__f_,_false>
                                 *)proto2_unittest::default_string_piece_extension);
    testing::internal::EqHelper::
    Compare<char[4],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
              ((EqHelper *)local_1bf0,"\"abc\"",
               "message.GetExtension(Traits::default_string_piece_extension)",(char (*) [4])"abc",
               psVar4);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1bf0);
    if (!bVar1) {
      testing::Message::Message(&local_1bf8);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1bf0);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_72.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xd0f,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_72.message_,&local_1bf8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_72.message_);
      testing::Message::~Message(&local_1bf8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_1bf0);
    psVar4 = proto2_unittest::TestAllExtensions::
             GetExtension<google::protobuf::internal::StringTypeTraits,_(unsigned_char)__f_,_false,_0>
                       (message,(ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::StringTypeTraits,_(unsigned_char)__f_,_false>
                                 *)proto2_unittest::default_cord_extension);
    testing::internal::EqHelper::
    Compare<char[4],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
              ((EqHelper *)local_1c10,"\"123\"",
               "message.GetExtension(Traits::default_cord_extension)",(char (*) [4])0x1df607c,psVar4
              );
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1c10);
    if (!bVar1) {
      testing::Message::Message(&local_1c18);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1c10);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar__58.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xd10,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__58.message_,&local_1c18)
      ;
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__58.message_);
      testing::Message::~Message(&local_1c18);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_1c10);
    bVar1 = proto2_unittest::TestAllExtensions::
            HasExtension<google::protobuf::internal::PrimitiveTypeTraits<unsigned_int>,(unsigned_char)13,false,google::protobuf::internal::PrimitiveTypeTraits<unsigned_int>>
                      (message,(ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::PrimitiveTypeTraits<unsigned_int>,_(unsigned_char)__r_,_false>
                                *)&proto2_unittest::oneof_uint32_extension);
    local_1c31 = (bool)(~bVar1 & 1);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_1c30,&local_1c31,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1c30);
    if (!bVar1) {
      testing::Message::Message(&local_1c40);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar__59.message_,(internal *)local_1c30,
                 (AssertionResult *)"message.HasExtension(Traits::oneof_uint32_extension)","true",
                 "false",in_R9);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_1c48,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xd12,pcVar3);
      testing::internal::AssertHelper::operator=(&local_1c48,&local_1c40);
      testing::internal::AssertHelper::~AssertHelper(&local_1c48);
      std::__cxx11::string::~string((string *)&gtest_ar__59.message_);
      testing::Message::~Message(&local_1c40);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_1c30);
    pTVar6 = proto2_unittest::TestAllExtensions::
             GetExtension<google::protobuf::internal::MessageTypeTraits<proto2_unittest::TestAllTypes_NestedMessage>,_(unsigned_char)__v_,_false,_0>
                       (message,(ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::MessageTypeTraits<proto2_unittest::TestAllTypes_NestedMessage>,_(unsigned_char)__v_,_false>
                                 *)proto2_unittest::oneof_nested_message_extension);
    bVar1 = proto2_unittest::TestAllTypes_NestedMessage::has_bb(pTVar6);
    local_1c79 = (bool)(~bVar1 & 1);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_1c78,&local_1c79,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1c78);
    if (!bVar1) {
      testing::Message::Message(&local_1c88);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar__60.message_,(internal *)local_1c78,
                 (AssertionResult *)
                 "message.GetExtension(Traits::oneof_nested_message_extension).has_bb()","true",
                 "false",in_R9);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_1c90,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xd14,pcVar3);
      testing::internal::AssertHelper::operator=(&local_1c90,&local_1c88);
      testing::internal::AssertHelper::~AssertHelper(&local_1c90);
      std::__cxx11::string::~string((string *)&gtest_ar__60.message_);
      testing::Message::~Message(&local_1c88);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_1c78);
    bVar1 = proto2_unittest::TestAllExtensions::
            HasExtension<google::protobuf::internal::StringTypeTraits,(unsigned_char)12,false,google::protobuf::internal::StringTypeTraits>
                      (message,(ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::StringTypeTraits,_(unsigned_char)__f_,_false>
                                *)proto2_unittest::oneof_string_extension);
    local_1cc1 = (bool)(~bVar1 & 1);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_1cc0,&local_1cc1,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1cc0);
    if (!bVar1) {
      testing::Message::Message(&local_1cd0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar__61.message_,(internal *)local_1cc0,
                 (AssertionResult *)"message.HasExtension(Traits::oneof_string_extension)","true",
                 "false",in_R9);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_1cd8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xd15,pcVar3);
      testing::internal::AssertHelper::operator=(&local_1cd8,&local_1cd0);
      testing::internal::AssertHelper::~AssertHelper(&local_1cd8);
      std::__cxx11::string::~string((string *)&gtest_ar__61.message_);
      testing::Message::~Message(&local_1cd0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_1cc0);
    bVar1 = proto2_unittest::TestAllExtensions::
            HasExtension<google::protobuf::internal::StringTypeTraits,(unsigned_char)12,false,google::protobuf::internal::StringTypeTraits>
                      (message,(ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::StringTypeTraits,_(unsigned_char)__f_,_false>
                                *)proto2_unittest::oneof_bytes_extension);
    local_1d09 = (bool)(~bVar1 & 1);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_1d08,&local_1d09,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1d08);
    if (!bVar1) {
      testing::Message::Message(&local_1d18);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_1d40,(internal *)local_1d08,
                 (AssertionResult *)"message.HasExtension(Traits::oneof_bytes_extension)","true",
                 "false",in_R9);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_1d20,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xd16,pcVar3);
      testing::internal::AssertHelper::operator=(&local_1d20,&local_1d18);
      testing::internal::AssertHelper::~AssertHelper(&local_1d20);
      std::__cxx11::string::~string((string *)&local_1d40);
      testing::Message::~Message(&local_1d18);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_1d08);
    gtest_ar.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._4_4_ = 0;
  }
  std::__cxx11::string::~string((string *)&gtest_ar_.message_);
  return;
}

Assistant:

void ExpectExtensionsClear(const TestAllExtensions& message) {
  using Traits = TestUtilTraits<TestAllExtensions>;
  std::string serialized;
  ASSERT_TRUE(message.SerializeToString(&serialized));
  EXPECT_EQ("", serialized);
  EXPECT_EQ(0, message.ByteSizeLong());

  // has_blah() should initially be false for all optional fields.
  EXPECT_FALSE(message.HasExtension(Traits::optional_int32_extension));
  EXPECT_FALSE(message.HasExtension(Traits::optional_int64_extension));
  EXPECT_FALSE(message.HasExtension(Traits::optional_uint32_extension));
  EXPECT_FALSE(message.HasExtension(Traits::optional_uint64_extension));
  EXPECT_FALSE(message.HasExtension(Traits::optional_sint32_extension));
  EXPECT_FALSE(message.HasExtension(Traits::optional_sint64_extension));
  EXPECT_FALSE(message.HasExtension(Traits::optional_fixed32_extension));
  EXPECT_FALSE(message.HasExtension(Traits::optional_fixed64_extension));
  EXPECT_FALSE(message.HasExtension(Traits::optional_sfixed32_extension));
  EXPECT_FALSE(message.HasExtension(Traits::optional_sfixed64_extension));
  EXPECT_FALSE(message.HasExtension(Traits::optional_float_extension));
  EXPECT_FALSE(message.HasExtension(Traits::optional_double_extension));
  EXPECT_FALSE(message.HasExtension(Traits::optional_bool_extension));
  EXPECT_FALSE(message.HasExtension(Traits::optional_string_extension));
  EXPECT_FALSE(message.HasExtension(Traits::optional_bytes_extension));

  EXPECT_FALSE(message.HasExtension(Traits::optionalgroup_extension));
  EXPECT_FALSE(message.HasExtension(Traits::optional_nested_message_extension));
  EXPECT_FALSE(
      message.HasExtension(Traits::optional_foreign_message_extension));
  EXPECT_FALSE(message.HasExtension(Traits::optional_import_message_extension));
  EXPECT_FALSE(
      message.HasExtension(Traits::optional_public_import_message_extension));
  EXPECT_FALSE(message.HasExtension(Traits::optional_lazy_message_extension));
  EXPECT_FALSE(
      message.HasExtension(Traits::optional_unverified_lazy_message_extension));

  EXPECT_FALSE(message.HasExtension(Traits::optional_nested_enum_extension));
  EXPECT_FALSE(message.HasExtension(Traits::optional_foreign_enum_extension));
  EXPECT_FALSE(message.HasExtension(Traits::optional_import_enum_extension));

  EXPECT_FALSE(message.HasExtension(Traits::optional_string_piece_extension));
  EXPECT_FALSE(message.HasExtension(Traits::optional_cord_extension));
  EXPECT_FALSE(message.HasExtension(Traits::optional_bytes_cord_extension));

  // Optional fields without defaults are set to zero or something like it.
  EXPECT_EQ(0, message.GetExtension(Traits::optional_int32_extension));
  EXPECT_EQ(0, message.GetExtension(Traits::optional_int64_extension));
  EXPECT_EQ(0, message.GetExtension(Traits::optional_uint32_extension));
  EXPECT_EQ(0, message.GetExtension(Traits::optional_uint64_extension));
  EXPECT_EQ(0, message.GetExtension(Traits::optional_sint32_extension));
  EXPECT_EQ(0, message.GetExtension(Traits::optional_sint64_extension));
  EXPECT_EQ(0, message.GetExtension(Traits::optional_fixed32_extension));
  EXPECT_EQ(0, message.GetExtension(Traits::optional_fixed64_extension));
  EXPECT_EQ(0, message.GetExtension(Traits::optional_sfixed32_extension));
  EXPECT_EQ(0, message.GetExtension(Traits::optional_sfixed64_extension));
  EXPECT_EQ(0, message.GetExtension(Traits::optional_float_extension));
  EXPECT_EQ(0, message.GetExtension(Traits::optional_double_extension));
  EXPECT_FALSE(message.GetExtension(Traits::optional_bool_extension));
  EXPECT_EQ("", message.GetExtension(Traits::optional_string_extension));
  EXPECT_EQ("", message.GetExtension(Traits::optional_bytes_extension));

  // Embedded messages should also be clear.
  EXPECT_FALSE(message.GetExtension(Traits::optionalgroup_extension).has_a());
  EXPECT_FALSE(
      message.GetExtension(Traits::optional_nested_message_extension).has_bb());
  EXPECT_FALSE(
      message.GetExtension(Traits::optional_foreign_message_extension).has_c());
  EXPECT_FALSE(
      message.GetExtension(Traits::optional_import_message_extension).has_d());
  EXPECT_FALSE(
      message.GetExtension(Traits::optional_public_import_message_extension)
          .has_e());
  EXPECT_FALSE(
      message.GetExtension(Traits::optional_lazy_message_extension).has_bb());
  EXPECT_FALSE(
      message.GetExtension(Traits::optional_unverified_lazy_message_extension)
          .has_bb());

  EXPECT_EQ(0, message.GetExtension(Traits::optionalgroup_extension).a());
  EXPECT_EQ(
      0, message.GetExtension(Traits::optional_nested_message_extension).bb());
  EXPECT_EQ(
      0, message.GetExtension(Traits::optional_foreign_message_extension).c());
  EXPECT_EQ(
      0, message.GetExtension(Traits::optional_import_message_extension).d());
  EXPECT_EQ(
      0, message.GetExtension(Traits::optional_public_import_message_extension)
             .e());
  EXPECT_EQ(0,
            message.GetExtension(Traits::optional_lazy_message_extension).bb());
  EXPECT_EQ(
      0,
      message.GetExtension(Traits::optional_unverified_lazy_message_extension)
          .bb());

  // Enums without defaults are set to the first value in the enum.
  EXPECT_EQ(Traits::TestAllTypes::FOO,
            message.GetExtension(Traits::optional_nested_enum_extension));
  EXPECT_EQ(Traits::FOREIGN_FOO,
            message.GetExtension(Traits::optional_foreign_enum_extension));
  EXPECT_EQ(Traits::IMPORT_FOO,
            message.GetExtension(Traits::optional_import_enum_extension));

  EXPECT_EQ("", message.GetExtension(Traits::optional_string_piece_extension));
  EXPECT_EQ("", message.GetExtension(Traits::optional_cord_extension));
  EXPECT_EQ("", message.GetExtension(Traits::optional_bytes_cord_extension));

  // Repeated fields are empty.
  EXPECT_EQ(0, message.ExtensionSize(Traits::repeated_int32_extension));
  EXPECT_EQ(0, message.ExtensionSize(Traits::repeated_int64_extension));
  EXPECT_EQ(0, message.ExtensionSize(Traits::repeated_uint32_extension));
  EXPECT_EQ(0, message.ExtensionSize(Traits::repeated_uint64_extension));
  EXPECT_EQ(0, message.ExtensionSize(Traits::repeated_sint32_extension));
  EXPECT_EQ(0, message.ExtensionSize(Traits::repeated_sint64_extension));
  EXPECT_EQ(0, message.ExtensionSize(Traits::repeated_fixed32_extension));
  EXPECT_EQ(0, message.ExtensionSize(Traits::repeated_fixed64_extension));
  EXPECT_EQ(0, message.ExtensionSize(Traits::repeated_sfixed32_extension));
  EXPECT_EQ(0, message.ExtensionSize(Traits::repeated_sfixed64_extension));
  EXPECT_EQ(0, message.ExtensionSize(Traits::repeated_float_extension));
  EXPECT_EQ(0, message.ExtensionSize(Traits::repeated_double_extension));
  EXPECT_EQ(0, message.ExtensionSize(Traits::repeated_bool_extension));
  EXPECT_EQ(0, message.ExtensionSize(Traits::repeated_string_extension));
  EXPECT_EQ(0, message.ExtensionSize(Traits::repeated_bytes_extension));

  EXPECT_EQ(0, message.ExtensionSize(Traits::repeatedgroup_extension));
  EXPECT_EQ(0,
            message.ExtensionSize(Traits::repeated_nested_message_extension));
  EXPECT_EQ(0,
            message.ExtensionSize(Traits::repeated_foreign_message_extension));
  EXPECT_EQ(0,
            message.ExtensionSize(Traits::repeated_import_message_extension));
  EXPECT_EQ(0, message.ExtensionSize(Traits::repeated_lazy_message_extension));
  EXPECT_EQ(0, message.ExtensionSize(Traits::repeated_nested_enum_extension));
  EXPECT_EQ(0, message.ExtensionSize(Traits::repeated_foreign_enum_extension));
  EXPECT_EQ(0, message.ExtensionSize(Traits::repeated_import_enum_extension));

  EXPECT_EQ(0, message.ExtensionSize(Traits::repeated_string_piece_extension));
  EXPECT_EQ(0, message.ExtensionSize(Traits::repeated_cord_extension));

  // has_blah() should also be false for all default fields.
  EXPECT_FALSE(message.HasExtension(Traits::default_int32_extension));
  EXPECT_FALSE(message.HasExtension(Traits::default_int64_extension));
  EXPECT_FALSE(message.HasExtension(Traits::default_uint32_extension));
  EXPECT_FALSE(message.HasExtension(Traits::default_uint64_extension));
  EXPECT_FALSE(message.HasExtension(Traits::default_sint32_extension));
  EXPECT_FALSE(message.HasExtension(Traits::default_sint64_extension));
  EXPECT_FALSE(message.HasExtension(Traits::default_fixed32_extension));
  EXPECT_FALSE(message.HasExtension(Traits::default_fixed64_extension));
  EXPECT_FALSE(message.HasExtension(Traits::default_sfixed32_extension));
  EXPECT_FALSE(message.HasExtension(Traits::default_sfixed64_extension));
  EXPECT_FALSE(message.HasExtension(Traits::default_float_extension));
  EXPECT_FALSE(message.HasExtension(Traits::default_double_extension));
  EXPECT_FALSE(message.HasExtension(Traits::default_bool_extension));
  EXPECT_FALSE(message.HasExtension(Traits::default_string_extension));
  EXPECT_FALSE(message.HasExtension(Traits::default_bytes_extension));

  EXPECT_FALSE(message.HasExtension(Traits::default_nested_enum_extension));
  EXPECT_FALSE(message.HasExtension(Traits::default_foreign_enum_extension));
  EXPECT_FALSE(message.HasExtension(Traits::default_import_enum_extension));

  EXPECT_FALSE(message.HasExtension(Traits::default_string_piece_extension));
  EXPECT_FALSE(message.HasExtension(Traits::default_cord_extension));

  // Fields with defaults have their default values (duh).
  EXPECT_EQ(41, message.GetExtension(Traits::default_int32_extension));
  EXPECT_EQ(42, message.GetExtension(Traits::default_int64_extension));
  EXPECT_EQ(43, message.GetExtension(Traits::default_uint32_extension));
  EXPECT_EQ(44, message.GetExtension(Traits::default_uint64_extension));
  EXPECT_EQ(-45, message.GetExtension(Traits::default_sint32_extension));
  EXPECT_EQ(46, message.GetExtension(Traits::default_sint64_extension));
  EXPECT_EQ(47, message.GetExtension(Traits::default_fixed32_extension));
  EXPECT_EQ(48, message.GetExtension(Traits::default_fixed64_extension));
  EXPECT_EQ(49, message.GetExtension(Traits::default_sfixed32_extension));
  EXPECT_EQ(-50, message.GetExtension(Traits::default_sfixed64_extension));
  EXPECT_EQ(51.5, message.GetExtension(Traits::default_float_extension));
  EXPECT_EQ(52e3, message.GetExtension(Traits::default_double_extension));
  EXPECT_TRUE(message.GetExtension(Traits::default_bool_extension));
  EXPECT_EQ("hello", message.GetExtension(Traits::default_string_extension));
  EXPECT_EQ("world", message.GetExtension(Traits::default_bytes_extension));

  EXPECT_EQ(Traits::TestAllTypes::BAR,
            message.GetExtension(Traits::default_nested_enum_extension));
  EXPECT_EQ(Traits::FOREIGN_BAR,
            message.GetExtension(Traits::default_foreign_enum_extension));
  EXPECT_EQ(Traits::IMPORT_BAR,
            message.GetExtension(Traits::default_import_enum_extension));

  EXPECT_EQ("abc",
            message.GetExtension(Traits::default_string_piece_extension));
  EXPECT_EQ("123", message.GetExtension(Traits::default_cord_extension));

  EXPECT_FALSE(message.HasExtension(Traits::oneof_uint32_extension));
  EXPECT_FALSE(
      message.GetExtension(Traits::oneof_nested_message_extension).has_bb());
  EXPECT_FALSE(message.HasExtension(Traits::oneof_string_extension));
  EXPECT_FALSE(message.HasExtension(Traits::oneof_bytes_extension));
}